

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  Primitive PVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  byte bVar80;
  byte bVar81;
  uint uVar82;
  ulong uVar83;
  byte bVar84;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  ulong uVar85;
  long lVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  uint uVar146;
  float pp;
  float fVar147;
  undefined4 uVar148;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar164;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar149 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar245;
  undefined1 auVar239 [16];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar214;
  float fVar215;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar225;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar223;
  float fVar224;
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  float fVar237;
  float fVar243;
  float fVar244;
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar246 [28];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float s;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_918;
  undefined2 local_912;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  RTCFilterFunctionNArguments local_8a0;
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_690;
  float local_688;
  float local_684;
  undefined4 local_680;
  uint local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  Primitive *local_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar130 [32];
  
  PVar12 = prim[1];
  uVar89 = (ulong)(byte)PVar12;
  fVar199 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar95 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  fVar198 = fVar199 * auVar95._0_4_;
  fVar147 = fVar199 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar89 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar92);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar89 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar96);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar89 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar89 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar97);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6);
  auVar110 = vpmovsxbd_avx2(auVar91);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar106 = vcvtdq2ps_avx(auVar110);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (uint)(byte)PVar12 * 0xc + uVar89 + 6);
  auVar102 = vpmovsxbd_avx2(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar88 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar107 = vpmovsxbd_avx2(auVar94);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar88 + uVar89 + 6);
  auVar108 = vpmovsxbd_avx2(auVar239);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar251 = ZEXT3264(auVar108);
  uVar83 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar100 = vpmovsxbd_avx2(auVar11);
  auVar109 = vcvtdq2ps_avx(auVar100);
  auVar120._4_4_ = fVar147;
  auVar120._0_4_ = fVar147;
  auVar120._8_4_ = fVar147;
  auVar120._12_4_ = fVar147;
  auVar120._16_4_ = fVar147;
  auVar120._20_4_ = fVar147;
  auVar120._24_4_ = fVar147;
  auVar120._28_4_ = fVar147;
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar112 = ZEXT1632(CONCAT412(fVar199 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar199 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar199 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar147))));
  auVar111 = vpermps_avx2(auVar122,auVar112);
  auVar99 = vpermps_avx512vl(auVar98,auVar112);
  fVar147 = auVar99._0_4_;
  fVar214 = auVar99._4_4_;
  auVar112._4_4_ = fVar214 * auVar104._4_4_;
  auVar112._0_4_ = fVar147 * auVar104._0_4_;
  fVar215 = auVar99._8_4_;
  auVar112._8_4_ = fVar215 * auVar104._8_4_;
  fVar216 = auVar99._12_4_;
  auVar112._12_4_ = fVar216 * auVar104._12_4_;
  fVar164 = auVar99._16_4_;
  auVar112._16_4_ = fVar164 * auVar104._16_4_;
  fVar217 = auVar99._20_4_;
  auVar112._20_4_ = fVar217 * auVar104._20_4_;
  fVar218 = auVar99._24_4_;
  auVar112._24_4_ = fVar218 * auVar104._24_4_;
  auVar112._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar102._4_4_ * fVar214;
  auVar110._0_4_ = auVar102._0_4_ * fVar147;
  auVar110._8_4_ = auVar102._8_4_ * fVar215;
  auVar110._12_4_ = auVar102._12_4_ * fVar216;
  auVar110._16_4_ = auVar102._16_4_ * fVar164;
  auVar110._20_4_ = auVar102._20_4_ * fVar217;
  auVar110._24_4_ = auVar102._24_4_ * fVar218;
  auVar110._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar109._4_4_ * fVar214;
  auVar100._0_4_ = auVar109._0_4_ * fVar147;
  auVar100._8_4_ = auVar109._8_4_ * fVar215;
  auVar100._12_4_ = auVar109._12_4_ * fVar216;
  auVar100._16_4_ = auVar109._16_4_ * fVar164;
  auVar100._20_4_ = auVar109._20_4_ * fVar217;
  auVar100._24_4_ = auVar109._24_4_ * fVar218;
  auVar100._28_4_ = auVar99._28_4_;
  auVar92 = vfmadd231ps_fma(auVar112,auVar111,auVar101);
  auVar96 = vfmadd231ps_fma(auVar110,auVar111,auVar106);
  auVar90 = vfmadd231ps_fma(auVar100,auVar108,auVar111);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar120,auVar103);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar120,auVar105);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar107,auVar120);
  auVar121._4_4_ = fVar198;
  auVar121._0_4_ = fVar198;
  auVar121._8_4_ = fVar198;
  auVar121._12_4_ = fVar198;
  auVar121._16_4_ = fVar198;
  auVar121._20_4_ = fVar198;
  auVar121._24_4_ = fVar198;
  auVar121._28_4_ = fVar198;
  auVar100 = ZEXT1632(CONCAT412(fVar199 * auVar95._12_4_,
                                CONCAT48(fVar199 * auVar95._8_4_,
                                         CONCAT44(fVar199 * auVar95._4_4_,fVar198))));
  auVar110 = vpermps_avx2(auVar122,auVar100);
  auVar100 = vpermps_avx512vl(auVar98,auVar100);
  fVar199 = auVar100._0_4_;
  fVar147 = auVar100._4_4_;
  auVar111._4_4_ = fVar147 * auVar104._4_4_;
  auVar111._0_4_ = fVar199 * auVar104._0_4_;
  fVar214 = auVar100._8_4_;
  auVar111._8_4_ = fVar214 * auVar104._8_4_;
  fVar215 = auVar100._12_4_;
  auVar111._12_4_ = fVar215 * auVar104._12_4_;
  fVar216 = auVar100._16_4_;
  auVar111._16_4_ = fVar216 * auVar104._16_4_;
  fVar164 = auVar100._20_4_;
  auVar111._20_4_ = fVar164 * auVar104._20_4_;
  fVar217 = auVar100._24_4_;
  auVar111._24_4_ = fVar217 * auVar104._24_4_;
  auVar111._28_4_ = 1;
  auVar98._4_4_ = auVar102._4_4_ * fVar147;
  auVar98._0_4_ = auVar102._0_4_ * fVar199;
  auVar98._8_4_ = auVar102._8_4_ * fVar214;
  auVar98._12_4_ = auVar102._12_4_ * fVar215;
  auVar98._16_4_ = auVar102._16_4_ * fVar216;
  auVar98._20_4_ = auVar102._20_4_ * fVar164;
  auVar98._24_4_ = auVar102._24_4_ * fVar217;
  auVar98._28_4_ = auVar104._28_4_;
  auVar102._4_4_ = auVar109._4_4_ * fVar147;
  auVar102._0_4_ = auVar109._0_4_ * fVar199;
  auVar102._8_4_ = auVar109._8_4_ * fVar214;
  auVar102._12_4_ = auVar109._12_4_ * fVar215;
  auVar102._16_4_ = auVar109._16_4_ * fVar216;
  auVar102._20_4_ = auVar109._20_4_ * fVar164;
  auVar102._24_4_ = auVar109._24_4_ * fVar217;
  auVar102._28_4_ = auVar100._28_4_;
  auVar97 = vfmadd231ps_fma(auVar111,auVar110,auVar101);
  auVar91 = vfmadd231ps_fma(auVar98,auVar110,auVar106);
  auVar93 = vfmadd231ps_fma(auVar102,auVar110,auVar108);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar121,auVar103);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar121,auVar105);
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117._16_4_ = 0x7fffffff;
  auVar117._20_4_ = 0x7fffffff;
  auVar117._24_4_ = 0x7fffffff;
  auVar117._28_4_ = 0x7fffffff;
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar121,auVar107);
  auVar103 = vandps_avx(ZEXT1632(auVar92),auVar117);
  auVar119._8_4_ = 0x219392ef;
  auVar119._0_8_ = 0x219392ef219392ef;
  auVar119._12_4_ = 0x219392ef;
  auVar119._16_4_ = 0x219392ef;
  auVar119._20_4_ = 0x219392ef;
  auVar119._24_4_ = 0x219392ef;
  auVar119._28_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar99._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar92._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar92._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar92._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar92._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar96),auVar117);
  uVar88 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar113._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar113._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar113._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar113._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar96._12_4_;
  auVar113._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar113._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar113._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar113._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar90),auVar117);
  uVar88 = vcmpps_avx512vl(auVar103,auVar119,1);
  bVar16 = (bool)((byte)uVar88 & 1);
  auVar103._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar90._0_4_;
  bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar90._4_4_;
  bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar90._8_4_;
  bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar90._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar88 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar118._8_4_ = 0x3f800000;
  auVar118._0_8_ = 0x3f8000003f800000;
  auVar118._12_4_ = 0x3f800000;
  auVar118._16_4_ = 0x3f800000;
  auVar118._20_4_ = 0x3f800000;
  auVar118._24_4_ = 0x3f800000;
  auVar118._28_4_ = 0x3f800000;
  auVar92 = vfnmadd213ps_fma(auVar99,auVar101,auVar118);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar113);
  auVar96 = vfnmadd213ps_fma(auVar113,auVar101,auVar118);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar90 = vfnmadd213ps_fma(auVar103,auVar101,auVar118);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar107._4_4_ = auVar92._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar92._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar92._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar92._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar102 = vpbroadcastd_avx512vl();
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar12 * 0x10 + 6));
  auVar116._0_4_ = auVar92._0_4_ * auVar103._0_4_;
  auVar116._4_4_ = auVar92._4_4_ * auVar103._4_4_;
  auVar116._8_4_ = auVar92._8_4_ * auVar103._8_4_;
  auVar116._12_4_ = auVar92._12_4_ * auVar103._12_4_;
  auVar116._16_4_ = auVar103._16_4_ * 0.0;
  auVar116._20_4_ = auVar103._20_4_ * 0.0;
  auVar116._24_4_ = auVar103._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar12 * 0x10 + uVar89 * -2 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar91));
  auVar108._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar91));
  auVar115._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar115._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar115._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar115._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar115._16_4_ = auVar103._16_4_ * 0.0;
  auVar115._20_4_ = auVar103._20_4_ * 0.0;
  auVar115._24_4_ = auVar103._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar89 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar109._4_4_ = auVar103._4_4_ * auVar90._4_4_;
  auVar109._0_4_ = auVar103._0_4_ * auVar90._0_4_;
  auVar109._8_4_ = auVar103._8_4_ * auVar90._8_4_;
  auVar109._12_4_ = auVar103._12_4_ * auVar90._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar89 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar93));
  auVar114._0_4_ = auVar90._0_4_ * auVar103._0_4_;
  auVar114._4_4_ = auVar90._4_4_ * auVar103._4_4_;
  auVar114._8_4_ = auVar90._8_4_ * auVar103._8_4_;
  auVar114._12_4_ = auVar90._12_4_ * auVar103._12_4_;
  auVar114._16_4_ = auVar103._16_4_ * 0.0;
  auVar114._20_4_ = auVar103._20_4_ * 0.0;
  auVar114._24_4_ = auVar103._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar107,auVar116);
  auVar101 = vpminsd_avx2(auVar108,auVar115);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar109,auVar114);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar104._4_4_ = uVar148;
  auVar104._0_4_ = uVar148;
  auVar104._8_4_ = uVar148;
  auVar104._12_4_ = uVar148;
  auVar104._16_4_ = uVar148;
  auVar104._20_4_ = uVar148;
  auVar104._24_4_ = uVar148;
  auVar104._28_4_ = uVar148;
  auVar101 = vmaxps_avx512vl(auVar101,auVar104);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar107,auVar116);
  auVar101 = vpmaxsd_avx2(auVar108,auVar115);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar109,auVar114);
  fVar199 = (ray->super_RayK<1>).tfar;
  auVar105._4_4_ = fVar199;
  auVar105._0_4_ = fVar199;
  auVar105._8_4_ = fVar199;
  auVar105._12_4_ = fVar199;
  auVar105._16_4_ = fVar199;
  auVar105._20_4_ = fVar199;
  auVar105._24_4_ = fVar199;
  auVar105._28_4_ = fVar199;
  auVar101 = vminps_avx512vl(auVar101,auVar105);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar106);
  uVar26 = vpcmpgtd_avx512vl(auVar102,_DAT_01fe9900);
  uVar24 = vcmpps_avx512vl(local_2e0,auVar103,2);
  if ((byte)((byte)uVar24 & (byte)uVar26) == 0) {
    return;
  }
  uVar88 = (ulong)(byte)((byte)uVar24 & (byte)uVar26);
  local_508 = prim;
LAB_01d08f40:
  lVar86 = 0;
  for (uVar83 = uVar88; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    lVar86 = lVar86 + 1;
  }
  local_910 = (ulong)*(uint *)(prim + 2);
  pGVar13 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_908 = (ulong)*(uint *)(prim + lVar86 * 4 + 6);
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                           pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar86 * 4 + 6));
  p_Var14 = pGVar13[1].intersectionFilterN;
  lVar86 = *(long *)&pGVar13[1].time_range.upper;
  auVar92 = *(undefined1 (*) [16])(lVar86 + (long)p_Var14 * uVar83);
  auVar96 = *(undefined1 (*) [16])(lVar86 + (uVar83 + 1) * (long)p_Var14);
  uVar88 = uVar88 - 1 & uVar88;
  if (uVar88 != 0) {
    uVar85 = uVar88 - 1 & uVar88;
    for (uVar89 = uVar88; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    }
    if (uVar85 != 0) {
      for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar227._0_4_ = auVar92._0_4_ + auVar96._0_4_;
  auVar227._4_4_ = auVar92._4_4_ + auVar96._4_4_;
  auVar227._8_4_ = auVar92._8_4_ + auVar96._8_4_;
  auVar227._12_4_ = auVar92._12_4_ + auVar96._12_4_;
  aVar9 = (ray->super_RayK<1>).org.field_0;
  aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar95._8_4_ = 0x3f000000;
  auVar95._0_8_ = 0x3f0000003f000000;
  auVar95._12_4_ = 0x3f000000;
  auVar90 = vmulps_avx512vl(auVar227,auVar95);
  auVar90 = vsubps_avx(auVar90,(undefined1  [16])aVar9);
  auVar90 = vdpps_avx(auVar90,(undefined1  [16])aVar10,0x7f);
  auVar97 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar93 = ZEXT816(0) << 0x40;
  auVar248 = ZEXT1664(auVar93);
  auVar238._4_12_ = ZEXT812(0) << 0x20;
  auVar238._0_4_ = auVar97._0_4_;
  auVar91 = vrcp14ss_avx512f(auVar93,auVar238);
  auVar97 = vfnmadd213ss_fma(auVar91,auVar97,ZEXT416(0x40000000));
  fVar199 = auVar90._0_4_ * auVar91._0_4_ * auVar97._0_4_;
  local_550 = ZEXT416((uint)fVar199);
  auVar228._4_4_ = fVar199;
  auVar228._0_4_ = fVar199;
  auVar228._8_4_ = fVar199;
  auVar228._12_4_ = fVar199;
  fStack_630 = fVar199;
  _local_640 = auVar228;
  fStack_62c = fVar199;
  fStack_628 = fVar199;
  fStack_624 = fVar199;
  auVar90 = vfmadd231ps_fma((undefined1  [16])aVar9,(undefined1  [16])aVar10,auVar228);
  auVar90 = vblendps_avx(auVar90,auVar93,8);
  auVar92 = vsubps_avx(auVar92,auVar90);
  uVar148 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_400._4_4_ = uVar148;
  local_400._0_4_ = uVar148;
  local_400._8_4_ = uVar148;
  local_400._12_4_ = uVar148;
  local_400._16_4_ = uVar148;
  local_400._20_4_ = uVar148;
  local_400._24_4_ = uVar148;
  local_400._28_4_ = uVar148;
  auVar242 = ZEXT3264(local_400);
  auVar97 = vsubps_avx(*(undefined1 (*) [16])(lVar86 + (uVar83 + 2) * (long)p_Var14),auVar90);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_420._4_4_ = uVar148;
  local_420._0_4_ = uVar148;
  local_420._8_4_ = uVar148;
  local_420._12_4_ = uVar148;
  local_420._16_4_ = uVar148;
  local_420._20_4_ = uVar148;
  local_420._24_4_ = uVar148;
  local_420._28_4_ = uVar148;
  local_440 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  auVar96 = vsubps_avx(auVar96,auVar90);
  auVar236 = ZEXT1664(auVar96);
  auVar90 = vsubps_avx(*(undefined1 (*) [16])(lVar86 + (uVar83 + 3) * (long)p_Var14),auVar90);
  local_700 = vbroadcastss_avx512vl(auVar92);
  auVar255 = ZEXT3264(local_700);
  auVar124._8_4_ = 1;
  auVar124._0_8_ = 0x100000001;
  auVar124._12_4_ = 1;
  auVar124._16_4_ = 1;
  auVar124._20_4_ = 1;
  auVar124._24_4_ = 1;
  auVar124._28_4_ = 1;
  local_5c0 = ZEXT1632(auVar92);
  local_720 = vpermps_avx512vl(auVar124,local_5c0);
  auVar256 = ZEXT3264(local_720);
  auVar127._8_4_ = 2;
  auVar127._0_8_ = 0x200000002;
  auVar127._12_4_ = 2;
  auVar127._16_4_ = 2;
  auVar127._20_4_ = 2;
  auVar127._24_4_ = 2;
  auVar127._28_4_ = 2;
  local_800 = vpermps_avx512vl(auVar127,local_5c0);
  auVar257 = ZEXT3264(local_800);
  auVar128._8_4_ = 3;
  auVar128._0_8_ = 0x300000003;
  auVar128._12_4_ = 3;
  auVar128._16_4_ = 3;
  auVar128._20_4_ = 3;
  auVar128._24_4_ = 3;
  auVar128._28_4_ = 3;
  local_740 = vpermps_avx512vl(auVar128,local_5c0);
  auVar258 = ZEXT3264(local_740);
  local_820 = vbroadcastss_avx512vl(auVar96);
  auVar259 = ZEXT3264(local_820);
  local_600 = ZEXT1632(auVar96);
  local_760 = vpermps_avx512vl(auVar124,local_600);
  auVar260 = ZEXT3264(local_760);
  local_840 = vpermps_avx512vl(auVar127,local_600);
  auVar261 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar128,local_600);
  auVar262 = ZEXT3264(local_860);
  local_780 = vbroadcastss_avx512vl(auVar97);
  auVar263 = ZEXT3264(local_780);
  local_5e0 = ZEXT1632(auVar97);
  local_7a0 = vpermps_avx512vl(auVar124,local_5e0);
  auVar264 = ZEXT3264(local_7a0);
  local_240 = vpermps_avx512vl(auVar127,local_5e0);
  local_1e0 = vpermps_avx2(auVar128,local_5e0);
  local_260 = vbroadcastss_avx512vl(auVar90);
  _local_620 = ZEXT1632(auVar90);
  local_220 = vpermps_avx512vl(auVar124,_local_620);
  local_2a0 = vpermps_avx2(auVar127,_local_620);
  local_2c0 = vpermps_avx2(auVar128,_local_620);
  auVar103 = vpermps_avx2(auVar127,ZEXT1632(CONCAT412(aVar10.field_3.w * aVar10.field_3.w,
                                                      CONCAT48(aVar10.z * aVar10.z,
                                                               CONCAT44(aVar10.y * aVar10.y,
                                                                        aVar10.x * aVar10.x)))));
  auVar92 = vfmadd231ps_fma(auVar103,local_420,local_420);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_400,local_400);
  local_200 = ZEXT1632(auVar92);
  auVar123._8_4_ = 0x7fffffff;
  auVar123._0_8_ = 0x7fffffff7fffffff;
  auVar123._12_4_ = 0x7fffffff;
  auVar123._16_4_ = 0x7fffffff;
  auVar123._20_4_ = 0x7fffffff;
  auVar123._24_4_ = 0x7fffffff;
  auVar123._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar92),auVar123);
  local_864 = 1;
  uVar83 = 0;
  local_3b0 = ZEXT816(0x3f80000000000000);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar265 = ZEXT3264(auVar103);
  auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar266 = ZEXT3264(auVar103);
  local_280 = local_220;
  do {
    auVar92 = vmovshdup_avx(local_3b0);
    auVar92 = vsubps_avx(auVar92,local_3b0);
    local_7e0._0_4_ = auVar92._0_4_;
    fVar164 = local_7e0._0_4_ * 0.04761905;
    uVar148 = local_3b0._0_4_;
    local_7c0._4_4_ = uVar148;
    local_7c0._0_4_ = uVar148;
    local_7c0._8_4_ = uVar148;
    local_7c0._12_4_ = uVar148;
    local_7c0._16_4_ = uVar148;
    local_7c0._20_4_ = uVar148;
    local_7c0._24_4_ = uVar148;
    local_7c0._28_4_ = uVar148;
    local_7e0._4_4_ = local_7e0._0_4_;
    local_7e0._8_4_ = local_7e0._0_4_;
    local_7e0._12_4_ = local_7e0._0_4_;
    local_7e0._16_4_ = local_7e0._0_4_;
    local_7e0._20_4_ = local_7e0._0_4_;
    local_7e0._24_4_ = local_7e0._0_4_;
    local_7e0._28_4_ = local_7e0._0_4_;
    auVar92 = vfmadd231ps_fma(local_7c0,local_7e0,_DAT_01faff20);
    auVar103 = vsubps_avx512vl(auVar265._0_32_,ZEXT1632(auVar92));
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar92),auVar266._0_32_);
    fVar217 = auVar103._0_4_;
    fVar218 = auVar103._4_4_;
    fVar198 = auVar103._8_4_;
    fVar223 = auVar103._12_4_;
    fVar224 = auVar103._16_4_;
    fVar225 = auVar103._20_4_;
    fVar226 = auVar103._24_4_;
    auVar46._4_4_ = fVar218 * fVar218 * auVar101._4_4_;
    auVar46._0_4_ = fVar217 * fVar217 * auVar101._0_4_;
    auVar46._8_4_ = fVar198 * fVar198 * auVar101._8_4_;
    auVar46._12_4_ = fVar223 * fVar223 * auVar101._12_4_;
    auVar46._16_4_ = fVar224 * fVar224 * auVar101._16_4_;
    auVar46._20_4_ = fVar225 * fVar225 * auVar101._20_4_;
    auVar46._24_4_ = fVar226 * fVar226 * auVar101._24_4_;
    auVar46._28_4_ = auVar101._28_4_;
    fVar147 = auVar92._0_4_;
    fVar214 = auVar92._4_4_;
    fVar215 = auVar92._8_4_;
    fVar216 = auVar92._12_4_;
    auVar236._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar214 * fVar214,fVar147 * fVar147)
                                    )));
    fVar237 = fVar147 * 3.0;
    fVar243 = fVar214 * 3.0;
    fVar244 = fVar215 * 3.0;
    fVar245 = fVar216 * 3.0;
    auVar265._28_36_ = auVar242._28_36_;
    auVar265._0_28_ = ZEXT1628(CONCAT412(fVar245,CONCAT48(fVar244,CONCAT44(fVar243,fVar237))));
    auVar175._0_4_ = (fVar237 + -5.0) * fVar147 * fVar147 + 2.0;
    auVar175._4_4_ = (fVar243 + -5.0) * fVar214 * fVar214 + 2.0;
    auVar175._8_4_ = (fVar244 + -5.0) * fVar215 * fVar215 + 2.0;
    auVar175._12_4_ = (fVar245 + -5.0) * fVar216 * fVar216 + 2.0;
    auVar175._16_4_ = 0x40000000;
    auVar175._20_4_ = 0x40000000;
    auVar175._24_4_ = 0x40000000;
    auVar175._28_4_ = DAT_01faff20._28_4_ + 2.0;
    auVar249._0_4_ = fVar217 * fVar217;
    auVar249._4_4_ = fVar218 * fVar218;
    auVar249._8_4_ = fVar198 * fVar198;
    auVar249._12_4_ = fVar223 * fVar223;
    auVar249._16_4_ = fVar224 * fVar224;
    auVar249._20_4_ = fVar225 * fVar225;
    auVar249._28_36_ = auVar248._28_36_;
    auVar249._24_4_ = fVar226 * fVar226;
    auVar193._0_4_ = auVar249._0_4_ * (fVar217 * 3.0 + -5.0) + 2.0;
    auVar193._4_4_ = auVar249._4_4_ * (fVar218 * 3.0 + -5.0) + 2.0;
    auVar193._8_4_ = auVar249._8_4_ * (fVar198 * 3.0 + -5.0) + 2.0;
    auVar193._12_4_ = auVar249._12_4_ * (fVar223 * 3.0 + -5.0) + 2.0;
    auVar193._16_4_ = auVar249._16_4_ * (fVar224 * 3.0 + -5.0) + 2.0;
    auVar193._20_4_ = auVar249._20_4_ * (fVar225 * 3.0 + -5.0) + 2.0;
    auVar193._24_4_ = auVar249._24_4_ * (fVar226 * 3.0 + -5.0) + 2.0;
    auVar193._28_4_ = auVar251._28_4_ + -5.0 + 2.0;
    auVar104 = vxorps_avx512vl(auVar103,auVar266._0_32_);
    auVar47._4_4_ = fVar214 * fVar214 * auVar104._4_4_;
    auVar47._0_4_ = fVar147 * fVar147 * auVar104._0_4_;
    auVar47._8_4_ = fVar215 * fVar215 * auVar104._8_4_;
    auVar47._12_4_ = fVar216 * fVar216 * auVar104._12_4_;
    auVar47._16_4_ = auVar104._16_4_ * 0.0 * 0.0;
    auVar47._20_4_ = auVar104._20_4_ * 0.0 * 0.0;
    auVar47._24_4_ = auVar104._24_4_ * 0.0 * 0.0;
    auVar47._28_4_ = auVar104._28_4_;
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar104 = vmulps_avx512vl(auVar46,auVar105);
    auVar106 = vmulps_avx512vl(auVar175,auVar105);
    auVar102 = vmulps_avx512vl(auVar193,auVar105);
    auVar107 = vmulps_avx512vl(auVar47,auVar105);
    auVar108 = vmulps_avx512vl(local_260,auVar107);
    auVar109 = vmulps_avx512vl(local_280,auVar107);
    auVar48._4_4_ = local_2a0._4_4_ * auVar107._4_4_;
    auVar48._0_4_ = local_2a0._0_4_ * auVar107._0_4_;
    auVar48._8_4_ = local_2a0._8_4_ * auVar107._8_4_;
    auVar48._12_4_ = local_2a0._12_4_ * auVar107._12_4_;
    auVar48._16_4_ = local_2a0._16_4_ * auVar107._16_4_;
    auVar48._20_4_ = local_2a0._20_4_ * auVar107._20_4_;
    auVar48._24_4_ = local_2a0._24_4_ * auVar107._24_4_;
    auVar48._28_4_ = auVar101._28_4_;
    auVar49._4_4_ = local_2c0._4_4_ * auVar107._4_4_;
    auVar49._0_4_ = local_2c0._0_4_ * auVar107._0_4_;
    auVar49._8_4_ = local_2c0._8_4_ * auVar107._8_4_;
    auVar49._12_4_ = local_2c0._12_4_ * auVar107._12_4_;
    auVar49._16_4_ = local_2c0._16_4_ * auVar107._16_4_;
    auVar49._20_4_ = local_2c0._20_4_ * auVar107._20_4_;
    auVar49._24_4_ = local_2c0._24_4_ * auVar107._24_4_;
    auVar49._28_4_ = auVar107._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar108,auVar102,auVar263._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar109,auVar102,auVar264._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar48,auVar102,local_240);
    auVar102 = vfmadd231ps_avx512vl(auVar49,local_1e0,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,auVar259._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar260._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar261._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar262._0_32_,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar255._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar104,auVar256._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar257._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar258._0_32_,auVar104);
    fVar199 = auVar103._28_4_;
    auVar50._4_4_ = (fVar218 + fVar218) * fVar214;
    auVar50._0_4_ = (fVar217 + fVar217) * fVar147;
    auVar50._8_4_ = (fVar198 + fVar198) * fVar215;
    auVar50._12_4_ = (fVar223 + fVar223) * fVar216;
    auVar50._16_4_ = (fVar224 + fVar224) * 0.0;
    auVar50._20_4_ = (fVar225 + fVar225) * 0.0;
    auVar50._24_4_ = (fVar226 + fVar226) * 0.0;
    auVar50._28_4_ = auVar106._28_4_;
    auVar103 = vsubps_avx(auVar50,auVar249._0_32_);
    auVar221._0_28_ =
         ZEXT1628(CONCAT412((fVar216 + fVar216) * (fVar245 + -5.0) + fVar245 * fVar216,
                            CONCAT48((fVar215 + fVar215) * (fVar244 + -5.0) + fVar244 * fVar215,
                                     CONCAT44((fVar214 + fVar214) * (fVar243 + -5.0) +
                                              fVar243 * fVar214,
                                              (fVar147 + fVar147) * (fVar237 + -5.0) +
                                              fVar237 * fVar147))));
    auVar221._28_4_ = auVar242._28_4_ + -5.0 + 0.0;
    auVar129._8_4_ = 0x40000000;
    auVar129._0_8_ = 0x4000000040000000;
    auVar129._12_4_ = 0x40000000;
    auVar129._16_4_ = 0x40000000;
    auVar129._20_4_ = 0x40000000;
    auVar129._24_4_ = 0x40000000;
    auVar129._28_4_ = 0x40000000;
    auVar101 = vaddps_avx512vl(auVar265._0_32_,auVar129);
    auVar51._4_4_ = (fVar218 + fVar218) * auVar101._4_4_;
    auVar51._0_4_ = (fVar217 + fVar217) * auVar101._0_4_;
    auVar51._8_4_ = (fVar198 + fVar198) * auVar101._8_4_;
    auVar51._12_4_ = (fVar223 + fVar223) * auVar101._12_4_;
    auVar51._16_4_ = (fVar224 + fVar224) * auVar101._16_4_;
    auVar51._20_4_ = (fVar225 + fVar225) * auVar101._20_4_;
    auVar51._24_4_ = (fVar226 + fVar226) * auVar101._24_4_;
    auVar51._28_4_ = auVar101._28_4_;
    auVar52._4_4_ = fVar218 * 3.0 * fVar218;
    auVar52._0_4_ = fVar217 * 3.0 * fVar217;
    auVar52._8_4_ = fVar198 * 3.0 * fVar198;
    auVar52._12_4_ = fVar223 * 3.0 * fVar223;
    auVar52._16_4_ = fVar224 * 3.0 * fVar224;
    auVar52._20_4_ = fVar225 * 3.0 * fVar225;
    auVar52._24_4_ = fVar226 * 3.0 * fVar226;
    auVar52._28_4_ = fVar199;
    auVar101 = vsubps_avx(auVar51,auVar52);
    auVar104 = vsubps_avx(auVar236._0_32_,auVar50);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar110 = vmulps_avx512vl(auVar221,auVar105);
    auVar101 = vmulps_avx512vl(auVar101,auVar105);
    auVar104 = vmulps_avx512vl(auVar104,auVar105);
    auVar105 = vmulps_avx512vl(local_260,auVar104);
    auVar100 = vmulps_avx512vl(local_280,auVar104);
    auVar53._4_4_ = local_2a0._4_4_ * auVar104._4_4_;
    auVar53._0_4_ = local_2a0._0_4_ * auVar104._0_4_;
    auVar53._8_4_ = local_2a0._8_4_ * auVar104._8_4_;
    auVar53._12_4_ = local_2a0._12_4_ * auVar104._12_4_;
    auVar53._16_4_ = local_2a0._16_4_ * auVar104._16_4_;
    auVar53._20_4_ = local_2a0._20_4_ * auVar104._20_4_;
    auVar53._24_4_ = local_2a0._24_4_ * auVar104._24_4_;
    auVar53._28_4_ = auVar106._28_4_;
    auVar54._4_4_ = local_2c0._4_4_ * auVar104._4_4_;
    auVar54._0_4_ = local_2c0._0_4_ * auVar104._0_4_;
    auVar54._8_4_ = local_2c0._8_4_ * auVar104._8_4_;
    auVar54._12_4_ = local_2c0._12_4_ * auVar104._12_4_;
    auVar54._16_4_ = local_2c0._16_4_ * auVar104._16_4_;
    auVar54._20_4_ = local_2c0._20_4_ * auVar104._20_4_;
    auVar54._24_4_ = local_2c0._24_4_ * auVar104._24_4_;
    auVar54._28_4_ = auVar104._28_4_;
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar263._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar100,auVar101,auVar264._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar53,auVar101,local_240);
    auVar101 = vfmadd231ps_avx512vl(auVar54,local_1e0,auVar101);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar259._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar260._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar110,auVar261._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar262._0_32_,auVar110);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar255._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,auVar256._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar257._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar101,auVar258._0_32_,auVar103);
    auVar55._4_4_ = auVar104._4_4_ * fVar164;
    auVar55._0_4_ = auVar104._0_4_ * fVar164;
    auVar55._8_4_ = auVar104._8_4_ * fVar164;
    auVar55._12_4_ = auVar104._12_4_ * fVar164;
    auVar55._16_4_ = auVar104._16_4_ * fVar164;
    auVar55._20_4_ = auVar104._20_4_ * fVar164;
    auVar55._24_4_ = auVar104._24_4_ * fVar164;
    auVar55._28_4_ = auVar251._28_4_;
    auVar251 = ZEXT3264(auVar55);
    auVar56._4_4_ = auVar105._4_4_ * fVar164;
    auVar56._0_4_ = auVar105._0_4_ * fVar164;
    auVar56._8_4_ = auVar105._8_4_ * fVar164;
    auVar56._12_4_ = auVar105._12_4_ * fVar164;
    auVar56._16_4_ = auVar105._16_4_ * fVar164;
    auVar56._20_4_ = auVar105._20_4_ * fVar164;
    auVar56._24_4_ = auVar105._24_4_ * fVar164;
    auVar56._28_4_ = fVar199 + fVar199;
    auVar57._4_4_ = auVar106._4_4_ * fVar164;
    auVar57._0_4_ = auVar106._0_4_ * fVar164;
    auVar57._8_4_ = auVar106._8_4_ * fVar164;
    auVar57._12_4_ = auVar106._12_4_ * fVar164;
    auVar57._16_4_ = auVar106._16_4_ * fVar164;
    auVar57._20_4_ = auVar106._20_4_ * fVar164;
    auVar57._24_4_ = auVar106._24_4_ * fVar164;
    auVar57._28_4_ = auVar106._28_4_;
    fVar199 = fVar164 * auVar103._0_4_;
    fVar147 = fVar164 * auVar103._4_4_;
    auVar58._4_4_ = fVar147;
    auVar58._0_4_ = fVar199;
    fVar214 = fVar164 * auVar103._8_4_;
    auVar58._8_4_ = fVar214;
    fVar215 = fVar164 * auVar103._12_4_;
    auVar58._12_4_ = fVar215;
    fVar216 = fVar164 * auVar103._16_4_;
    auVar58._16_4_ = fVar216;
    fVar217 = fVar164 * auVar103._20_4_;
    auVar58._20_4_ = fVar217;
    fVar218 = fVar164 * auVar103._24_4_;
    auVar58._24_4_ = fVar218;
    auVar58._28_4_ = fVar164;
    auVar92 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
    auVar110 = vpermt2ps_avx512vl(auVar109,_DAT_01feed00,ZEXT1632(auVar92));
    auVar242 = ZEXT3264(auVar110);
    auVar100 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,ZEXT1632(auVar92));
    auVar104 = ZEXT1632(auVar92);
    auVar111 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar104);
    auVar248 = ZEXT3264(auVar111);
    auVar222._0_4_ = auVar102._0_4_ + fVar199;
    auVar222._4_4_ = auVar102._4_4_ + fVar147;
    auVar222._8_4_ = auVar102._8_4_ + fVar214;
    auVar222._12_4_ = auVar102._12_4_ + fVar215;
    auVar222._16_4_ = auVar102._16_4_ + fVar216;
    auVar222._20_4_ = auVar102._20_4_ + fVar217;
    auVar222._24_4_ = auVar102._24_4_ + fVar218;
    auVar222._28_4_ = auVar102._28_4_ + fVar164;
    auVar103 = vmaxps_avx(auVar102,auVar222);
    auVar101 = vminps_avx(auVar102,auVar222);
    auVar112 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar104);
    auVar98 = vpermt2ps_avx512vl(auVar55,_DAT_01feed00,auVar104);
    auVar99 = vpermt2ps_avx512vl(auVar56,_DAT_01feed00,auVar104);
    auVar123 = ZEXT1632(auVar92);
    auVar113 = vpermt2ps_avx512vl(auVar57,_DAT_01feed00,auVar123);
    auVar104 = vpermt2ps_avx512vl(auVar58,_DAT_01feed00,auVar123);
    auVar104 = vsubps_avx(auVar112,auVar104);
    auVar105 = vsubps_avx(auVar110,auVar109);
    auVar236 = ZEXT3264(auVar105);
    auVar106 = vsubps_avx(auVar100,auVar107);
    auVar102 = vsubps_avx(auVar111,auVar108);
    auVar114 = vmulps_avx512vl(auVar106,auVar57);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar56,auVar102);
    auVar115 = vmulps_avx512vl(auVar102,auVar55);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar57,auVar105);
    auVar116 = vmulps_avx512vl(auVar105,auVar56);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar55,auVar106);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar102,auVar102);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar106,auVar106);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar105,auVar105);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar265 = ZEXT3264(auVar117);
    auVar118 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar117);
    auVar116 = vfmadd132ps_avx512vl(auVar118,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar116);
    auVar118 = vmulps_avx512vl(auVar106,auVar113);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar99,auVar102);
    auVar119 = vmulps_avx512vl(auVar102,auVar98);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar113,auVar105);
    auVar120 = vmulps_avx512vl(auVar105,auVar99);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar98,auVar106);
    auVar120 = vmulps_avx512vl(auVar120,auVar120);
    auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar116 = vmulps_avx512vl(auVar118,auVar116);
    auVar114 = vmaxps_avx512vl(auVar114,auVar116);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar116 = vmaxps_avx512vl(auVar104,auVar112);
    auVar103 = vmaxps_avx512vl(auVar103,auVar116);
    auVar116 = vaddps_avx512vl(auVar114,auVar103);
    auVar103 = vminps_avx(auVar104,auVar112);
    auVar103 = vminps_avx(auVar101,auVar103);
    auVar103 = vsubps_avx512vl(auVar103,auVar114);
    auVar36._8_4_ = 0x3f800002;
    auVar36._0_8_ = 0x3f8000023f800002;
    auVar36._12_4_ = 0x3f800002;
    auVar36._16_4_ = 0x3f800002;
    auVar36._20_4_ = 0x3f800002;
    auVar36._24_4_ = 0x3f800002;
    auVar36._28_4_ = 0x3f800002;
    auVar101 = vmulps_avx512vl(auVar116,auVar36);
    auVar37._8_4_ = 0x3f7ffffc;
    auVar37._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar37._12_4_ = 0x3f7ffffc;
    auVar37._16_4_ = 0x3f7ffffc;
    auVar37._20_4_ = 0x3f7ffffc;
    auVar37._24_4_ = 0x3f7ffffc;
    auVar37._28_4_ = 0x3f7ffffc;
    local_900 = vmulps_avx512vl(auVar103,auVar37);
    auVar103 = vmulps_avx512vl(auVar101,auVar101);
    auVar101 = vrsqrt14ps_avx512vl(auVar115);
    auVar38._8_4_ = 0xbf000000;
    auVar38._0_8_ = 0xbf000000bf000000;
    auVar38._12_4_ = 0xbf000000;
    auVar38._16_4_ = 0xbf000000;
    auVar38._20_4_ = 0xbf000000;
    auVar38._24_4_ = 0xbf000000;
    auVar38._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar115,auVar38);
    fVar199 = auVar101._0_4_;
    fVar147 = auVar101._4_4_;
    fVar214 = auVar101._8_4_;
    fVar215 = auVar101._12_4_;
    fVar216 = auVar101._16_4_;
    fVar164 = auVar101._20_4_;
    fVar217 = auVar101._24_4_;
    auVar59._4_4_ = fVar147 * fVar147 * fVar147 * auVar104._4_4_;
    auVar59._0_4_ = fVar199 * fVar199 * fVar199 * auVar104._0_4_;
    auVar59._8_4_ = fVar214 * fVar214 * fVar214 * auVar104._8_4_;
    auVar59._12_4_ = fVar215 * fVar215 * fVar215 * auVar104._12_4_;
    auVar59._16_4_ = fVar216 * fVar216 * fVar216 * auVar104._16_4_;
    auVar59._20_4_ = fVar164 * fVar164 * fVar164 * auVar104._20_4_;
    auVar59._24_4_ = fVar217 * fVar217 * fVar217 * auVar104._24_4_;
    auVar59._28_4_ = auVar116._28_4_;
    auVar39._8_4_ = 0x3fc00000;
    auVar39._0_8_ = 0x3fc000003fc00000;
    auVar39._12_4_ = 0x3fc00000;
    auVar39._16_4_ = 0x3fc00000;
    auVar39._20_4_ = 0x3fc00000;
    auVar39._24_4_ = 0x3fc00000;
    auVar39._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar59,auVar101,auVar39);
    auVar104 = vmulps_avx512vl(auVar105,auVar101);
    auVar112 = vmulps_avx512vl(auVar106,auVar101);
    auVar114 = vmulps_avx512vl(auVar102,auVar101);
    auVar115 = vsubps_avx512vl(auVar123,auVar109);
    auVar116 = vsubps_avx512vl(auVar123,auVar107);
    auVar118 = vsubps_avx512vl(auVar123,auVar108);
    auVar75._4_4_ = uStack_43c;
    auVar75._0_4_ = local_440;
    auVar75._8_4_ = uStack_438;
    auVar75._12_4_ = uStack_434;
    auVar75._16_4_ = uStack_430;
    auVar75._20_4_ = uStack_42c;
    auVar75._24_4_ = uStack_428;
    auVar75._28_4_ = uStack_424;
    auVar119 = vmulps_avx512vl(auVar75,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_420,auVar116);
    auVar119 = vfmadd231ps_avx512vl(auVar119,local_400,auVar115);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar116,auVar116);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar115);
    auVar121 = vmulps_avx512vl(auVar75,auVar114);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar112,local_420);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar104,local_400);
    auVar114 = vmulps_avx512vl(auVar118,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar114,auVar116,auVar112);
    auVar104 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar104);
    auVar112 = vmulps_avx512vl(auVar121,auVar121);
    auVar114 = vsubps_avx512vl(local_200,auVar112);
    auVar122 = vmulps_avx512vl(auVar121,auVar104);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar119 = vaddps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar104,auVar104);
    local_580 = vsubps_avx512vl(auVar120,auVar122);
    auVar103 = vsubps_avx512vl(local_580,auVar103);
    local_5a0 = vmulps_avx512vl(auVar119,auVar119);
    auVar40._8_4_ = 0x40800000;
    auVar40._0_8_ = 0x4080000040800000;
    auVar40._12_4_ = 0x40800000;
    auVar40._16_4_ = 0x40800000;
    auVar40._20_4_ = 0x40800000;
    auVar40._24_4_ = 0x40800000;
    auVar40._28_4_ = 0x40800000;
    _local_6c0 = vmulps_avx512vl(auVar114,auVar40);
    auVar120 = vmulps_avx512vl(_local_6c0,auVar103);
    auVar120 = vsubps_avx512vl(local_5a0,auVar120);
    uVar89 = vcmpps_avx512vl(auVar120,auVar123,5);
    bVar80 = (byte)uVar89;
    fVar199 = (float)local_640._0_4_;
    fVar147 = (float)local_640._4_4_;
    fVar214 = fStack_638;
    fVar215 = fStack_634;
    fVar216 = fStack_630;
    fVar164 = fStack_62c;
    fVar217 = fStack_628;
    fVar218 = fStack_624;
    if (bVar80 == 0) {
LAB_01d09bff:
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar266 = ZEXT3264(auVar103);
      auVar255 = ZEXT3264(local_700);
      auVar256 = ZEXT3264(local_720);
      auVar257 = ZEXT3264(local_800);
      auVar258 = ZEXT3264(local_740);
      auVar259 = ZEXT3264(local_820);
      auVar260 = ZEXT3264(local_760);
      auVar261 = ZEXT3264(local_840);
      auVar262 = ZEXT3264(local_860);
      auVar263 = ZEXT3264(local_780);
      auVar264 = ZEXT3264(local_7a0);
    }
    else {
      auVar122 = _local_6c0;
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar123 = vaddps_avx512vl(auVar114,auVar114);
      local_660 = vrcp14ps_avx512vl(auVar123);
      auVar117 = vfnmadd213ps_avx512vl(local_660,auVar123,auVar117);
      auVar117 = vfmadd132ps_avx512vl(auVar117,local_660,local_660);
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41._16_4_ = 0x80000000;
      auVar41._20_4_ = 0x80000000;
      auVar41._24_4_ = 0x80000000;
      auVar41._28_4_ = 0x80000000;
      local_4a0 = vxorps_avx512vl(auVar119,auVar41);
      auVar124 = vsubps_avx512vl(local_4a0,auVar120);
      local_6e0 = vmulps_avx512vl(auVar124,auVar117);
      auVar120 = vsubps_avx512vl(auVar120,auVar119);
      local_480 = vmulps_avx512vl(auVar120,auVar117);
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar120 = vblendmps_avx512vl(auVar120,local_6e0);
      auVar125._0_4_ =
           (uint)(bVar80 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar117._0_4_;
      bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar117._4_4_;
      bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar117._8_4_;
      bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar117._12_4_;
      bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar117._16_4_;
      bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar117._20_4_;
      bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar117._24_4_;
      bVar16 = SUB81(uVar89 >> 7,0);
      auVar125._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar117,local_480);
      auVar126._0_4_ =
           (uint)(bVar80 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar117._0_4_;
      bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar16 * auVar120._4_4_ | (uint)!bVar16 * auVar117._4_4_;
      bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar16 * auVar120._8_4_ | (uint)!bVar16 * auVar117._8_4_;
      bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar16 * auVar120._12_4_ | (uint)!bVar16 * auVar117._12_4_;
      bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar16 * auVar120._16_4_ | (uint)!bVar16 * auVar117._16_4_;
      bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar16 * auVar120._20_4_ | (uint)!bVar16 * auVar117._20_4_;
      bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar16 * auVar120._24_4_ | (uint)!bVar16 * auVar117._24_4_;
      bVar16 = SUB81(uVar89 >> 7,0);
      auVar126._28_4_ = (uint)bVar16 * auVar120._28_4_ | (uint)!bVar16 * auVar117._28_4_;
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar117);
      local_4c0 = vmaxps_avx512vl(local_220,auVar117);
      auVar42._8_4_ = 0x36000000;
      auVar42._0_8_ = 0x3600000036000000;
      auVar42._12_4_ = 0x36000000;
      auVar42._16_4_ = 0x36000000;
      auVar42._20_4_ = 0x36000000;
      auVar42._24_4_ = 0x36000000;
      auVar42._28_4_ = 0x36000000;
      local_4e0 = vmulps_avx512vl(local_4c0,auVar42);
      vandps_avx512vl(auVar114,auVar117);
      uVar85 = vcmpps_avx512vl(local_4e0,local_4e0,1);
      uVar89 = uVar89 & uVar85;
      bVar84 = (byte)uVar89;
      if (bVar84 != 0) {
        uVar85 = vcmpps_avx512vl(auVar103,_DAT_01faff00,2);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar114 = vblendmps_avx512vl(auVar103,auVar112);
        bVar15 = (byte)uVar85;
        uVar87 = (uint)(bVar15 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar15 & 1) * local_4e0._0_4_;
        bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
        uVar82 = (uint)bVar16 * auVar114._4_4_ | (uint)!bVar16 * local_4e0._4_4_;
        bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
        uVar141 = (uint)bVar16 * auVar114._8_4_ | (uint)!bVar16 * local_4e0._8_4_;
        bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
        uVar142 = (uint)bVar16 * auVar114._12_4_ | (uint)!bVar16 * local_4e0._12_4_;
        bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
        uVar143 = (uint)bVar16 * auVar114._16_4_ | (uint)!bVar16 * local_4e0._16_4_;
        bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
        uVar144 = (uint)bVar16 * auVar114._20_4_ | (uint)!bVar16 * local_4e0._20_4_;
        bVar16 = (bool)((byte)(uVar85 >> 6) & 1);
        uVar145 = (uint)bVar16 * auVar114._24_4_ | (uint)!bVar16 * local_4e0._24_4_;
        bVar16 = SUB81(uVar85 >> 7,0);
        uVar146 = (uint)bVar16 * auVar114._28_4_ | (uint)!bVar16 * local_4e0._28_4_;
        auVar125._0_4_ = (bVar84 & 1) * uVar87 | !(bool)(bVar84 & 1) * auVar125._0_4_;
        bVar16 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar125._4_4_ = bVar16 * uVar82 | !bVar16 * auVar125._4_4_;
        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar125._8_4_ = bVar16 * uVar141 | !bVar16 * auVar125._8_4_;
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar125._12_4_ = bVar16 * uVar142 | !bVar16 * auVar125._12_4_;
        bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar125._16_4_ = bVar16 * uVar143 | !bVar16 * auVar125._16_4_;
        bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar125._20_4_ = bVar16 * uVar144 | !bVar16 * auVar125._20_4_;
        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar125._24_4_ = bVar16 * uVar145 | !bVar16 * auVar125._24_4_;
        bVar16 = SUB81(uVar89 >> 7,0);
        auVar125._28_4_ = bVar16 * uVar146 | !bVar16 * auVar125._28_4_;
        auVar103 = vblendmps_avx512vl(auVar112,auVar103);
        bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar85 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar85 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar85 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar85 >> 5) & 1);
        bVar22 = (bool)((byte)(uVar85 >> 6) & 1);
        bVar23 = SUB81(uVar85 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar84 & 1) *
             ((uint)(bVar15 & 1) * auVar103._0_4_ | !(bool)(bVar15 & 1) * uVar87) |
             !(bool)(bVar84 & 1) * auVar126._0_4_;
        bVar17 = (bool)((byte)(uVar89 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar17 * ((uint)bVar16 * auVar103._4_4_ | !bVar16 * uVar82) |
             !bVar17 * auVar126._4_4_;
        bVar16 = (bool)((byte)(uVar89 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar16 * ((uint)bVar18 * auVar103._8_4_ | !bVar18 * uVar141) |
             !bVar16 * auVar126._8_4_;
        bVar16 = (bool)((byte)(uVar89 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar16 * ((uint)bVar19 * auVar103._12_4_ | !bVar19 * uVar142) |
             !bVar16 * auVar126._12_4_;
        bVar16 = (bool)((byte)(uVar89 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar16 * ((uint)bVar20 * auVar103._16_4_ | !bVar20 * uVar143) |
             !bVar16 * auVar126._16_4_;
        bVar16 = (bool)((byte)(uVar89 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar16 * ((uint)bVar21 * auVar103._20_4_ | !bVar21 * uVar144) |
             !bVar16 * auVar126._20_4_;
        bVar16 = (bool)((byte)(uVar89 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar16 * ((uint)bVar22 * auVar103._24_4_ | !bVar22 * uVar145) |
             !bVar16 * auVar126._24_4_;
        bVar16 = SUB81(uVar89 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar16 * ((uint)bVar23 * auVar103._28_4_ | !bVar23 * uVar146) |
             !bVar16 * auVar126._28_4_;
        bVar80 = (~bVar84 | bVar15) & bVar80;
      }
      if ((bVar80 & 0x7f) == 0) {
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar103);
        goto LAB_01d09bff;
      }
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar113,auVar112);
      auVar98 = vxorps_avx512vl(auVar98,auVar112);
      auVar99 = vxorps_avx512vl(auVar99,auVar112);
      auVar92 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_550);
      auVar103 = vbroadcastss_avx512vl(auVar92);
      auVar103 = vmaxps_avx512vl(auVar103,auVar125);
      auVar92 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_550);
      auVar114 = vbroadcastss_avx512vl(auVar92);
      auVar114 = vminps_avx512vl(auVar114,auVar126);
      auVar117 = vmulps_avx512vl(auVar118,auVar57);
      auVar116 = vfmadd213ps_avx512vl(auVar116,auVar56,auVar117);
      auVar92 = vfmadd213ps_fma(auVar115,auVar55,auVar116);
      auVar76._4_4_ = uStack_43c;
      auVar76._0_4_ = local_440;
      auVar76._8_4_ = uStack_438;
      auVar76._12_4_ = uStack_434;
      auVar76._16_4_ = uStack_430;
      auVar76._20_4_ = uStack_42c;
      auVar76._24_4_ = uStack_428;
      auVar76._28_4_ = uStack_424;
      auVar115 = vmulps_avx512vl(auVar76,auVar57);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_420,auVar56);
      auVar115 = vfmadd231ps_avx512vl(auVar115,local_400,auVar55);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar115,auVar116);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar24 = vcmpps_avx512vl(auVar116,auVar117,1);
      auVar118 = vxorps_avx512vl(ZEXT1632(auVar92),auVar112);
      auVar120 = vrcp14ps_avx512vl(auVar115);
      auVar124 = vxorps_avx512vl(auVar115,auVar112);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar128 = vfnmadd213ps_avx512vl(auVar120,auVar115,auVar127);
      auVar92 = vfmadd132ps_fma(auVar128,auVar120,auVar120);
      fVar198 = auVar92._0_4_ * auVar118._0_4_;
      fVar223 = auVar92._4_4_ * auVar118._4_4_;
      auVar60._4_4_ = fVar223;
      auVar60._0_4_ = fVar198;
      fVar224 = auVar92._8_4_ * auVar118._8_4_;
      auVar60._8_4_ = fVar224;
      fVar225 = auVar92._12_4_ * auVar118._12_4_;
      auVar60._12_4_ = fVar225;
      fVar226 = auVar118._16_4_ * 0.0;
      auVar60._16_4_ = fVar226;
      fVar237 = auVar118._20_4_ * 0.0;
      auVar60._20_4_ = fVar237;
      fVar243 = auVar118._24_4_ * 0.0;
      auVar60._24_4_ = fVar243;
      auVar60._28_4_ = auVar118._28_4_;
      uVar26 = vcmpps_avx512vl(auVar115,auVar124,1);
      bVar84 = (byte)uVar24 | (byte)uVar26;
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar129 = vblendmps_avx512vl(auVar60,auVar128);
      auVar130._0_4_ =
           (uint)(bVar84 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar120._0_4_;
      bVar16 = (bool)(bVar84 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar120._4_4_;
      bVar16 = (bool)(bVar84 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar120._8_4_;
      bVar16 = (bool)(bVar84 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar120._12_4_;
      bVar16 = (bool)(bVar84 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar120._16_4_;
      bVar16 = (bool)(bVar84 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar120._20_4_;
      bVar16 = (bool)(bVar84 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar120._24_4_;
      auVar130._28_4_ =
           (uint)(bVar84 >> 7) * auVar129._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar120._28_4_;
      auVar120 = vmaxps_avx512vl(auVar103,auVar130);
      auVar251 = ZEXT3264(auVar120);
      uVar26 = vcmpps_avx512vl(auVar115,auVar124,6);
      bVar84 = (byte)uVar24 | (byte)uVar26;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131._0_4_ =
           (uint)(bVar84 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar198;
      bVar16 = (bool)(bVar84 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * (int)fVar223;
      bVar16 = (bool)(bVar84 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * (int)fVar224;
      bVar16 = (bool)(bVar84 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * (int)fVar225;
      bVar16 = (bool)(bVar84 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar16 * auVar115._16_4_ | (uint)!bVar16 * (int)fVar226;
      bVar16 = (bool)(bVar84 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar16 * auVar115._20_4_ | (uint)!bVar16 * (int)fVar237;
      bVar16 = (bool)(bVar84 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar16 * auVar115._24_4_ | (uint)!bVar16 * (int)fVar243;
      auVar131._28_4_ =
           (uint)(bVar84 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar118._28_4_;
      auVar114 = vminps_avx512vl(auVar114,auVar131);
      auVar103 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar110 = vsubps_avx(ZEXT832(0) << 0x20,auVar100);
      auVar118 = ZEXT832(0) << 0x20;
      auVar100 = vsubps_avx(auVar118,auVar111);
      auVar100 = vmulps_avx512vl(auVar100,auVar113);
      auVar110 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar110);
      auVar103 = vfmadd231ps_avx512vl(auVar110,auVar98,auVar103);
      auVar110 = vmulps_avx512vl(auVar76,auVar113);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_420,auVar99);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_400,auVar98);
      vandps_avx512vl(auVar110,auVar116);
      uVar24 = vcmpps_avx512vl(auVar110,auVar117,1);
      auVar103 = vxorps_avx512vl(auVar103,auVar112);
      auVar100 = vrcp14ps_avx512vl(auVar110);
      auVar111 = vxorps_avx512vl(auVar110,auVar112);
      auVar248 = ZEXT3264(auVar111);
      auVar112 = vfnmadd213ps_avx512vl(auVar100,auVar110,auVar127);
      auVar92 = vfmadd132ps_fma(auVar112,auVar100,auVar100);
      fVar198 = auVar92._0_4_ * auVar103._0_4_;
      fVar223 = auVar92._4_4_ * auVar103._4_4_;
      auVar61._4_4_ = fVar223;
      auVar61._0_4_ = fVar198;
      fVar224 = auVar92._8_4_ * auVar103._8_4_;
      auVar61._8_4_ = fVar224;
      fVar225 = auVar92._12_4_ * auVar103._12_4_;
      auVar61._12_4_ = fVar225;
      fVar226 = auVar103._16_4_ * 0.0;
      auVar61._16_4_ = fVar226;
      fVar237 = auVar103._20_4_ * 0.0;
      auVar61._20_4_ = fVar237;
      fVar243 = auVar103._24_4_ * 0.0;
      auVar61._24_4_ = fVar243;
      auVar61._28_4_ = auVar103._28_4_;
      uVar26 = vcmpps_avx512vl(auVar110,auVar111,1);
      bVar84 = (byte)uVar24 | (byte)uVar26;
      auVar112 = vblendmps_avx512vl(auVar61,auVar128);
      auVar132._0_4_ =
           (uint)(bVar84 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar100._0_4_;
      bVar16 = (bool)(bVar84 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar100._4_4_;
      bVar16 = (bool)(bVar84 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar100._8_4_;
      bVar16 = (bool)(bVar84 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar100._12_4_;
      bVar16 = (bool)(bVar84 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * auVar100._16_4_;
      bVar16 = (bool)(bVar84 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * auVar100._20_4_;
      bVar16 = (bool)(bVar84 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * auVar100._24_4_;
      auVar132._28_4_ =
           (uint)(bVar84 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar100._28_4_;
      _local_500 = vmaxps_avx(auVar120,auVar132);
      uVar26 = vcmpps_avx512vl(auVar110,auVar111,6);
      bVar84 = (byte)uVar24 | (byte)uVar26;
      auVar133._0_4_ =
           (uint)(bVar84 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar198;
      bVar16 = (bool)(bVar84 >> 1 & 1);
      auVar133._4_4_ = (uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * (int)fVar223;
      bVar16 = (bool)(bVar84 >> 2 & 1);
      auVar133._8_4_ = (uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * (int)fVar224;
      bVar16 = (bool)(bVar84 >> 3 & 1);
      auVar133._12_4_ = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * (int)fVar225;
      bVar16 = (bool)(bVar84 >> 4 & 1);
      auVar133._16_4_ = (uint)bVar16 * auVar115._16_4_ | (uint)!bVar16 * (int)fVar226;
      bVar16 = (bool)(bVar84 >> 5 & 1);
      auVar133._20_4_ = (uint)bVar16 * auVar115._20_4_ | (uint)!bVar16 * (int)fVar237;
      bVar16 = (bool)(bVar84 >> 6 & 1);
      auVar133._24_4_ = (uint)bVar16 * auVar115._24_4_ | (uint)!bVar16 * (int)fVar243;
      auVar133._28_4_ =
           (uint)(bVar84 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar103._28_4_;
      local_320 = vminps_avx(auVar114,auVar133);
      auVar242 = ZEXT3264(local_320);
      auVar103 = _local_500;
      uVar24 = vcmpps_avx512vl(_local_500,local_320,2);
      bVar80 = bVar80 & 0x7f & (byte)uVar24;
      if (bVar80 == 0) {
        auVar265 = ZEXT3264(auVar127);
        goto LAB_01d09bff;
      }
      auVar110 = vmaxps_avx(auVar118,local_900);
      auVar100 = vfmadd213ps_avx512vl(local_6e0,auVar121,auVar104);
      fVar198 = auVar101._0_4_;
      fVar223 = auVar101._4_4_;
      auVar62._4_4_ = fVar223 * auVar100._4_4_;
      auVar62._0_4_ = fVar198 * auVar100._0_4_;
      fVar224 = auVar101._8_4_;
      auVar62._8_4_ = fVar224 * auVar100._8_4_;
      fVar225 = auVar101._12_4_;
      auVar62._12_4_ = fVar225 * auVar100._12_4_;
      fVar226 = auVar101._16_4_;
      auVar62._16_4_ = fVar226 * auVar100._16_4_;
      fVar237 = auVar101._20_4_;
      auVar62._20_4_ = fVar237 * auVar100._20_4_;
      fVar243 = auVar101._24_4_;
      auVar62._24_4_ = fVar243 * auVar100._24_4_;
      auVar62._28_4_ = auVar100._28_4_;
      auVar100 = vfmadd213ps_avx512vl(local_480,auVar121,auVar104);
      auVar63._4_4_ = fVar223 * auVar100._4_4_;
      auVar63._0_4_ = fVar198 * auVar100._0_4_;
      auVar63._8_4_ = fVar224 * auVar100._8_4_;
      auVar63._12_4_ = fVar225 * auVar100._12_4_;
      auVar63._16_4_ = fVar226 * auVar100._16_4_;
      auVar63._20_4_ = fVar237 * auVar100._20_4_;
      auVar63._24_4_ = fVar243 * auVar100._24_4_;
      auVar63._28_4_ = auVar100._28_4_;
      auVar100 = vminps_avx512vl(auVar62,auVar127);
      auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
      auVar112 = vminps_avx512vl(auVar63,auVar127);
      auVar64._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar64._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar64._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar64._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar64._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar64._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar64._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar64._28_4_ = auVar100._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar64,local_7e0,local_7c0);
      auVar100 = vmaxps_avx(auVar112,ZEXT832(0) << 0x20);
      auVar65._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar65._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar65._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar65._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar65._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar65._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar65._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar65._28_4_ = auVar100._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar65,local_7e0,local_7c0);
      auVar66._4_4_ = auVar110._4_4_ * auVar110._4_4_;
      auVar66._0_4_ = auVar110._0_4_ * auVar110._0_4_;
      auVar66._8_4_ = auVar110._8_4_ * auVar110._8_4_;
      auVar66._12_4_ = auVar110._12_4_ * auVar110._12_4_;
      auVar66._16_4_ = auVar110._16_4_ * auVar110._16_4_;
      auVar66._20_4_ = auVar110._20_4_ * auVar110._20_4_;
      auVar66._24_4_ = auVar110._24_4_ * auVar110._24_4_;
      auVar66._28_4_ = auVar110._28_4_;
      auVar100 = vsubps_avx(local_580,auVar66);
      auVar67._4_4_ = auVar100._4_4_ * (float)local_6c0._4_4_;
      auVar67._0_4_ = auVar100._0_4_ * (float)local_6c0._0_4_;
      auVar67._8_4_ = auVar100._8_4_ * fStack_6b8;
      auVar67._12_4_ = auVar100._12_4_ * fStack_6b4;
      auVar67._16_4_ = auVar100._16_4_ * fStack_6b0;
      auVar67._20_4_ = auVar100._20_4_ * fStack_6ac;
      auVar67._24_4_ = auVar100._24_4_ * fStack_6a8;
      auVar67._28_4_ = auVar110._28_4_;
      auVar110 = vsubps_avx(local_5a0,auVar67);
      uVar89 = vcmpps_avx512vl(auVar110,ZEXT832(0) << 0x20,5);
      auVar260 = ZEXT3264(local_760);
      auVar263 = ZEXT3264(local_780);
      auVar264 = ZEXT3264(local_7a0);
      if ((byte)uVar89 == 0) {
        uVar89 = 0;
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar248 = ZEXT864(0) << 0x20;
        auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar112 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar246 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar134._8_4_ = 0x7f800000;
        auVar134._0_8_ = 0x7f8000007f800000;
        auVar134._12_4_ = 0x7f800000;
        auVar134._16_4_ = 0x7f800000;
        auVar134._20_4_ = 0x7f800000;
        auVar134._24_4_ = 0x7f800000;
        auVar134._28_4_ = 0x7f800000;
        auVar135._8_4_ = 0xff800000;
        auVar135._0_8_ = 0xff800000ff800000;
        auVar135._12_4_ = 0xff800000;
        auVar135._16_4_ = 0xff800000;
        auVar135._20_4_ = 0xff800000;
        auVar135._24_4_ = 0xff800000;
        auVar135._28_4_ = 0xff800000;
        auVar254._8_4_ = 0x3e99999a;
        auVar254._0_8_ = 0x3e99999a3e99999a;
        auVar254._12_4_ = 0x3e99999a;
        auVar254._16_4_ = 0x3e99999a;
        auVar254._20_4_ = 0x3e99999a;
        auVar254._24_4_ = 0x3e99999a;
        auVar254._28_4_ = 0x3e99999a;
      }
      else {
        uVar85 = vcmpps_avx512vl(auVar110,auVar118,5);
        auVar110 = vsqrtps_avx(auVar110);
        auVar111 = vfnmadd213ps_avx512vl(auVar123,local_660,auVar127);
        auVar98 = vfmadd132ps_avx512vl(auVar111,local_660,local_660);
        auVar111 = vsubps_avx(local_4a0,auVar110);
        auVar99 = vmulps_avx512vl(auVar111,auVar98);
        auVar110 = vsubps_avx512vl(auVar110,auVar119);
        auVar98 = vmulps_avx512vl(auVar110,auVar98);
        auVar110 = vfmadd213ps_avx512vl(auVar121,auVar99,auVar104);
        auVar68._4_4_ = fVar223 * auVar110._4_4_;
        auVar68._0_4_ = fVar198 * auVar110._0_4_;
        auVar68._8_4_ = fVar224 * auVar110._8_4_;
        auVar68._12_4_ = fVar225 * auVar110._12_4_;
        auVar68._16_4_ = fVar226 * auVar110._16_4_;
        auVar68._20_4_ = fVar237 * auVar110._20_4_;
        auVar68._24_4_ = fVar243 * auVar110._24_4_;
        auVar68._28_4_ = auVar112._28_4_;
        auVar110 = vmulps_avx512vl(local_400,auVar99);
        auVar111 = vmulps_avx512vl(local_420,auVar99);
        auVar77._4_4_ = uStack_43c;
        auVar77._0_4_ = local_440;
        auVar77._8_4_ = uStack_438;
        auVar77._12_4_ = uStack_434;
        auVar77._16_4_ = uStack_430;
        auVar77._20_4_ = uStack_42c;
        auVar77._24_4_ = uStack_428;
        auVar77._28_4_ = uStack_424;
        auVar113 = vmulps_avx512vl(auVar77,auVar99);
        auVar112 = vfmadd213ps_avx512vl(auVar105,auVar68,auVar109);
        auVar110 = vsubps_avx512vl(auVar110,auVar112);
        auVar112 = vfmadd213ps_avx512vl(auVar106,auVar68,auVar107);
        auVar112 = vsubps_avx512vl(auVar111,auVar112);
        auVar92 = vfmadd213ps_fma(auVar68,auVar102,auVar108);
        auVar111 = vsubps_avx(auVar113,ZEXT1632(auVar92));
        auVar246 = auVar111._0_28_;
        auVar104 = vfmadd213ps_avx512vl(auVar121,auVar98,auVar104);
        auVar69._4_4_ = fVar223 * auVar104._4_4_;
        auVar69._0_4_ = fVar198 * auVar104._0_4_;
        auVar69._8_4_ = fVar224 * auVar104._8_4_;
        auVar69._12_4_ = fVar225 * auVar104._12_4_;
        auVar69._16_4_ = fVar226 * auVar104._16_4_;
        auVar69._20_4_ = fVar237 * auVar104._20_4_;
        auVar69._24_4_ = fVar243 * auVar104._24_4_;
        auVar69._28_4_ = auVar101._28_4_;
        auVar101 = vmulps_avx512vl(local_400,auVar98);
        auVar104 = vmulps_avx512vl(local_420,auVar98);
        auVar113 = vmulps_avx512vl(auVar77,auVar98);
        auVar92 = vfmadd213ps_fma(auVar105,auVar69,auVar109);
        auVar111 = vsubps_avx(auVar101,ZEXT1632(auVar92));
        auVar92 = vfmadd213ps_fma(auVar106,auVar69,auVar107);
        auVar101 = vsubps_avx(auVar104,ZEXT1632(auVar92));
        auVar92 = vfmadd213ps_fma(auVar102,auVar69,auVar108);
        auVar104 = vsubps_avx512vl(auVar113,ZEXT1632(auVar92));
        auVar248 = ZEXT3264(auVar104);
        auVar156._8_4_ = 0x7f800000;
        auVar156._0_8_ = 0x7f8000007f800000;
        auVar156._12_4_ = 0x7f800000;
        auVar156._16_4_ = 0x7f800000;
        auVar156._20_4_ = 0x7f800000;
        auVar156._24_4_ = 0x7f800000;
        auVar156._28_4_ = 0x7f800000;
        auVar104 = vblendmps_avx512vl(auVar156,auVar99);
        bVar16 = (bool)((byte)uVar85 & 1);
        auVar134._0_4_ = (uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar109._0_4_;
        bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar109._4_4_;
        bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar109._8_4_;
        bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar109._12_4_;
        bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar109._16_4_;
        bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar109._20_4_;
        bVar16 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar109._24_4_;
        bVar16 = SUB81(uVar85 >> 7,0);
        auVar134._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar109._28_4_;
        auVar157._8_4_ = 0xff800000;
        auVar157._0_8_ = 0xff800000ff800000;
        auVar157._12_4_ = 0xff800000;
        auVar157._16_4_ = 0xff800000;
        auVar157._20_4_ = 0xff800000;
        auVar157._24_4_ = 0xff800000;
        auVar157._28_4_ = 0xff800000;
        auVar104 = vblendmps_avx512vl(auVar157,auVar98);
        bVar16 = (bool)((byte)uVar85 & 1);
        auVar135._0_4_ = (uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * -0x800000;
        bVar16 = SUB81(uVar85 >> 7,0);
        auVar135._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * -0x800000;
        auVar43._8_4_ = 0x36000000;
        auVar43._0_8_ = 0x3600000036000000;
        auVar43._12_4_ = 0x36000000;
        auVar43._16_4_ = 0x36000000;
        auVar43._20_4_ = 0x36000000;
        auVar43._24_4_ = 0x36000000;
        auVar43._28_4_ = 0x36000000;
        auVar104 = vmulps_avx512vl(local_4c0,auVar43);
        uVar25 = vcmpps_avx512vl(auVar104,local_4e0,0xe);
        uVar85 = uVar85 & uVar25;
        bVar84 = (byte)uVar85;
        auVar254._8_4_ = 0x3e99999a;
        auVar254._0_8_ = 0x3e99999a3e99999a;
        auVar254._12_4_ = 0x3e99999a;
        auVar254._16_4_ = 0x3e99999a;
        auVar254._20_4_ = 0x3e99999a;
        auVar254._24_4_ = 0x3e99999a;
        auVar254._28_4_ = 0x3e99999a;
        if (bVar84 != 0) {
          uVar25 = vcmpps_avx512vl(auVar100,ZEXT832(0) << 0x20,2);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar104 = vblendmps_avx512vl(auVar234,auVar250);
          bVar15 = (byte)uVar25;
          iVar1 = (uint)(bVar15 & 1) * auVar104._0_4_;
          iVar2 = (uint)((byte)(uVar25 >> 1) & 1) * auVar104._4_4_;
          iVar3 = (uint)((byte)(uVar25 >> 2) & 1) * auVar104._8_4_;
          iVar4 = (uint)((byte)(uVar25 >> 3) & 1) * auVar104._12_4_;
          iVar5 = (uint)((byte)(uVar25 >> 4) & 1) * auVar104._16_4_;
          iVar6 = (uint)((byte)(uVar25 >> 5) & 1) * auVar104._20_4_;
          iVar7 = (uint)((byte)(uVar25 >> 6) & 1) * auVar104._24_4_;
          iVar8 = (uint)(byte)(uVar25 >> 7) * auVar104._28_4_;
          auVar134._0_4_ = (uint)(bVar84 & 1) * iVar1 | !(bool)(bVar84 & 1) * auVar134._0_4_;
          bVar16 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar16 * iVar2 | !bVar16 * auVar134._4_4_;
          bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar16 * iVar3 | !bVar16 * auVar134._8_4_;
          bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar16 * iVar4 | !bVar16 * auVar134._12_4_;
          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar134._16_4_ = (uint)bVar16 * iVar5 | !bVar16 * auVar134._16_4_;
          bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar134._20_4_ = (uint)bVar16 * iVar6 | !bVar16 * auVar134._20_4_;
          bVar16 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar134._24_4_ = (uint)bVar16 * iVar7 | !bVar16 * auVar134._24_4_;
          bVar16 = SUB81(uVar85 >> 7,0);
          auVar134._28_4_ = (uint)bVar16 * iVar8 | !bVar16 * auVar134._28_4_;
          auVar104 = vblendmps_avx512vl(auVar250,auVar234);
          bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar25 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar25 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar25 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar25 >> 5) & 1);
          bVar22 = (bool)((byte)(uVar25 >> 6) & 1);
          bVar23 = SUB81(uVar25 >> 7,0);
          auVar135._0_4_ =
               (uint)(bVar84 & 1) *
               ((uint)(bVar15 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar15 & 1) * iVar1) |
               !(bool)(bVar84 & 1) * auVar135._0_4_;
          bVar17 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar135._4_4_ =
               (uint)bVar17 * ((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * iVar2) |
               !bVar17 * auVar135._4_4_;
          bVar16 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar135._8_4_ =
               (uint)bVar16 * ((uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * iVar3) |
               !bVar16 * auVar135._8_4_;
          bVar16 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar135._12_4_ =
               (uint)bVar16 * ((uint)bVar19 * auVar104._12_4_ | (uint)!bVar19 * iVar4) |
               !bVar16 * auVar135._12_4_;
          bVar16 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar135._16_4_ =
               (uint)bVar16 * ((uint)bVar20 * auVar104._16_4_ | (uint)!bVar20 * iVar5) |
               !bVar16 * auVar135._16_4_;
          bVar16 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar135._20_4_ =
               (uint)bVar16 * ((uint)bVar21 * auVar104._20_4_ | (uint)!bVar21 * iVar6) |
               !bVar16 * auVar135._20_4_;
          bVar16 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar135._24_4_ =
               (uint)bVar16 * ((uint)bVar22 * auVar104._24_4_ | (uint)!bVar22 * iVar7) |
               !bVar16 * auVar135._24_4_;
          bVar16 = SUB81(uVar85 >> 7,0);
          auVar135._28_4_ =
               (uint)bVar16 * ((uint)bVar23 * auVar104._28_4_ | (uint)!bVar23 * iVar8) |
               !bVar16 * auVar135._28_4_;
          uVar89 = (ulong)(byte)((~bVar84 | bVar15) & (byte)uVar89);
        }
      }
      auVar257 = ZEXT3264(local_800);
      auVar259 = ZEXT3264(local_820);
      auVar261 = ZEXT3264(local_840);
      auVar262 = ZEXT3264(local_860);
      uVar148 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar231._4_4_ = uVar148;
      auVar231._0_4_ = uVar148;
      auVar231._8_4_ = uVar148;
      auVar231._12_4_ = uVar148;
      auVar231._16_4_ = uVar148;
      auVar231._20_4_ = uVar148;
      auVar231._24_4_ = uVar148;
      auVar231._28_4_ = uVar148;
      uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar235._4_4_ = uVar148;
      auVar235._0_4_ = uVar148;
      auVar235._8_4_ = uVar148;
      auVar235._12_4_ = uVar148;
      auVar235._16_4_ = uVar148;
      auVar235._20_4_ = uVar148;
      auVar235._24_4_ = uVar148;
      auVar235._28_4_ = uVar148;
      auVar236 = ZEXT3264(auVar235);
      fVar198 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar251 = ZEXT3264(CONCAT428(fVar198,CONCAT424(fVar198,CONCAT420(fVar198,CONCAT416(fVar198,
                                                  CONCAT412(fVar198,CONCAT48(fVar198,CONCAT44(
                                                  fVar198,fVar198))))))));
      auVar255._0_4_ = fVar198 * auVar248._0_4_;
      auVar255._4_4_ = fVar198 * auVar248._4_4_;
      auVar255._8_4_ = fVar198 * auVar248._8_4_;
      auVar255._12_4_ = fVar198 * auVar248._12_4_;
      auVar255._16_4_ = fVar198 * auVar248._16_4_;
      auVar255._20_4_ = fVar198 * auVar248._20_4_;
      auVar255._28_36_ = auVar248._28_36_;
      auVar255._24_4_ = fVar198 * auVar248._24_4_;
      auVar92 = vfmadd231ps_fma(auVar255._0_32_,auVar235,auVar101);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar231,auVar111);
      _local_380 = _local_500;
      local_360 = vminps_avx(local_320,auVar134);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar248 = ZEXT3264(auVar247);
      auVar101 = vandps_avx(auVar247,ZEXT1632(auVar92));
      local_460 = vmaxps_avx(_local_500,auVar135);
      local_340 = local_460;
      uVar24 = vcmpps_avx512vl(auVar101,auVar254,1);
      local_912 = (short)uVar24;
      uVar24 = vcmpps_avx512vl(_local_500,local_360,2);
      bVar84 = (byte)uVar24 & bVar80;
      uVar26 = vcmpps_avx512vl(local_460,local_320,2);
      auVar255 = ZEXT3264(local_700);
      auVar256 = ZEXT3264(local_720);
      auVar258 = ZEXT3264(local_740);
      if ((bVar80 & ((byte)uVar26 | (byte)uVar24)) == 0) {
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar265 = ZEXT3264(auVar103);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar266 = ZEXT3264(auVar103);
      }
      else {
        auVar70._4_4_ = auVar246._4_4_ * fVar198;
        auVar70._0_4_ = auVar246._0_4_ * fVar198;
        auVar70._8_4_ = auVar246._8_4_ * fVar198;
        auVar70._12_4_ = auVar246._12_4_ * fVar198;
        auVar70._16_4_ = auVar246._16_4_ * fVar198;
        auVar70._20_4_ = auVar246._20_4_ * fVar198;
        auVar70._24_4_ = auVar246._24_4_ * fVar198;
        auVar70._28_4_ = local_460._28_4_;
        auVar92 = vfmadd213ps_fma(auVar112,auVar235,auVar70);
        auVar92 = vfmadd213ps_fma(auVar110,auVar231,ZEXT1632(auVar92));
        auVar101 = vandps_avx(auVar247,ZEXT1632(auVar92));
        uVar24 = vcmpps_avx512vl(auVar101,auVar254,1);
        local_86c = (int)CONCAT71((int7)(uVar89 >> 8),~(byte)uVar89);
        bVar15 = (byte)uVar24 | ~(byte)uVar89;
        auVar160._8_4_ = 2;
        auVar160._0_8_ = 0x200000002;
        auVar160._12_4_ = 2;
        auVar160._16_4_ = 2;
        auVar160._20_4_ = 2;
        auVar160._24_4_ = 2;
        auVar160._28_4_ = 2;
        auVar44._8_4_ = 3;
        auVar44._0_8_ = 0x300000003;
        auVar44._12_4_ = 3;
        auVar44._16_4_ = 3;
        auVar44._20_4_ = 3;
        auVar44._24_4_ = 3;
        auVar44._28_4_ = 3;
        auVar101 = vpblendmd_avx512vl(auVar160,auVar44);
        local_300._0_4_ = (uint)(bVar15 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar15 & 1) * 2;
        bVar16 = (bool)(bVar15 >> 1 & 1);
        local_300._4_4_ = (uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar15 >> 2 & 1);
        local_300._8_4_ = (uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar15 >> 3 & 1);
        local_300._12_4_ = (uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar15 >> 4 & 1);
        local_300._16_4_ = (uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar15 >> 5 & 1);
        local_300._20_4_ = (uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar15 >> 6 & 1);
        local_300._24_4_ = (uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * 2;
        local_300._28_4_ = (uint)(bVar15 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar15 >> 7) * 2;
        local_3a0 = vpbroadcastd_avx512vl();
        uVar24 = vpcmpd_avx512vl(local_3a0,local_300,5);
        local_868 = (uint)bVar84;
        bVar84 = (byte)uVar24 & bVar84;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        _local_6c0 = auVar122;
        if (bVar84 == 0) {
          fVar199 = (ray->super_RayK<1>).tfar;
          auVar162._4_4_ = fVar199;
          auVar162._0_4_ = fVar199;
          auVar162._8_4_ = fVar199;
          auVar162._12_4_ = fVar199;
          auVar162._16_4_ = fVar199;
          auVar162._20_4_ = fVar199;
          auVar162._24_4_ = fVar199;
          auVar162._28_4_ = fVar199;
        }
        else {
          auVar96 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar92 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar90 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar97 = vminps_avx(auVar96,auVar90);
          auVar96 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar90 = vmaxps_avx(auVar92,auVar96);
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar92 = vandps_avx(auVar97,auVar179);
          auVar96 = vandps_avx(auVar90,auVar179);
          auVar92 = vmaxps_avx(auVar92,auVar96);
          auVar96 = vmovshdup_avx(auVar92);
          auVar96 = vmaxss_avx(auVar96,auVar92);
          auVar92 = vshufpd_avx(auVar92,auVar92,1);
          auVar92 = vmaxss_avx(auVar92,auVar96);
          fVar199 = auVar92._0_4_ * 1.9073486e-06;
          local_540 = vshufps_avx(auVar90,auVar90,0xff);
          local_3e0 = (float)local_500._0_4_ + (float)local_640._0_4_;
          fStack_3dc = (float)local_500._4_4_ + (float)local_640._4_4_;
          fStack_3d8 = fStack_4f8 + fStack_638;
          fStack_3d4 = fStack_4f4 + fStack_634;
          fStack_3d0 = fStack_4f0 + fStack_630;
          fStack_3cc = fStack_4ec + fStack_62c;
          fStack_3c8 = fStack_4e8 + fStack_628;
          fStack_3c4 = fStack_4e4 + fStack_624;
          _local_500 = auVar103;
          do {
            auVar104 = local_900;
            auVar161._8_4_ = 0x7f800000;
            auVar161._0_8_ = 0x7f8000007f800000;
            auVar161._12_4_ = 0x7f800000;
            auVar161._16_4_ = 0x7f800000;
            auVar161._20_4_ = 0x7f800000;
            auVar161._24_4_ = 0x7f800000;
            auVar161._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar161,_local_500);
            auVar137._0_4_ =
                 (uint)(bVar84 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 6 & 1);
            auVar137._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 0x7f800000;
            auVar137._28_4_ =
                 (uint)(bVar84 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar84 >> 7) * 0x7f800000;
            auVar103 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar103 = vminps_avx(auVar137,auVar103);
            auVar101 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar101);
            auVar101 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar101);
            uVar24 = vcmpps_avx512vl(auVar137,auVar103,0);
            bVar81 = (byte)uVar24 & bVar84;
            bVar15 = bVar84;
            if (bVar81 != 0) {
              bVar15 = bVar81;
            }
            iVar1 = 0;
            for (uVar87 = (uint)bVar15; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar9 = (ray->super_RayK<1>).dir.field_0;
            local_580._0_16_ = (undefined1  [16])aVar9;
            auVar92 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            if (auVar92._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar84;
              local_900._2_30_ = auVar104._2_30_;
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_380 + (uint)(iVar1 << 2)));
              fVar147 = sqrtf(auVar92._0_4_);
              bVar84 = local_900[0];
              auVar92 = local_7e0._0_16_;
              auVar96 = local_7c0._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar147 = auVar92._0_4_;
              auVar92 = ZEXT416(*(uint *)(local_380 + (uint)(iVar1 << 2)));
              auVar96 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
            }
            auVar92 = vinsertps_avx(auVar92,auVar96,0x10);
            lVar86 = 5;
            do {
              uVar148 = auVar92._0_4_;
              auVar150._4_4_ = uVar148;
              auVar150._0_4_ = uVar148;
              auVar150._8_4_ = uVar148;
              auVar150._12_4_ = uVar148;
              auVar90 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_580._0_16_);
              auVar96 = vmovshdup_avx(auVar92);
              fVar217 = auVar96._0_4_;
              fVar218 = 1.0 - fVar217;
              fVar214 = fVar217 * fVar217;
              auVar239 = SUB6416(ZEXT464(0x40400000),0);
              auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar91 = vfmadd213ss_fma(auVar239,auVar96,auVar94);
              auVar97 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar214),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar93 = vfmadd213ss_fma(auVar239,ZEXT416((uint)fVar218),auVar94);
              auVar93 = vfmadd213ss_fma(auVar93,ZEXT416((uint)(fVar218 * fVar218)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar215 = fVar218 * fVar218 * -fVar217 * 0.5;
              fVar216 = auVar97._0_4_ * 0.5;
              fVar164 = auVar93._0_4_ * 0.5;
              fVar217 = fVar217 * fVar217 * -fVar218 * 0.5;
              auVar200._0_4_ = fVar217 * (float)local_620._0_4_;
              auVar200._4_4_ = fVar217 * (float)local_620._4_4_;
              auVar200._8_4_ = fVar217 * fStack_618;
              auVar200._12_4_ = fVar217 * fStack_614;
              auVar219._4_4_ = fVar164;
              auVar219._0_4_ = fVar164;
              auVar219._8_4_ = fVar164;
              auVar219._12_4_ = fVar164;
              auVar97 = vfmadd132ps_fma(auVar219,auVar200,local_5e0._0_16_);
              auVar180._4_4_ = fVar216;
              auVar180._0_4_ = fVar216;
              auVar180._8_4_ = fVar216;
              auVar180._12_4_ = fVar216;
              auVar97 = vfmadd132ps_fma(auVar180,auVar97,local_600._0_16_);
              auVar201._4_4_ = fVar215;
              auVar201._0_4_ = fVar215;
              auVar201._8_4_ = fVar215;
              auVar201._12_4_ = fVar215;
              auVar97 = vfmadd132ps_fma(auVar201,auVar97,local_5c0._0_16_);
              auVar93 = vfmadd231ss_fma(auVar94,auVar96,ZEXT416(0x41100000));
              local_4a0._0_16_ = auVar93;
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar96,ZEXT416(0x40800000));
              local_4c0._0_16_ = auVar93;
              local_900._0_16_ = auVar96;
              auVar96 = vfmadd213ss_fma(auVar239,auVar96,ZEXT416(0xbf800000));
              local_4e0._0_16_ = auVar96;
              local_480._0_16_ = auVar97;
              auVar96 = vsubps_avx(auVar90,auVar97);
              local_7c0._0_16_ = auVar96;
              auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
              local_7e0._0_16_ = auVar96;
              local_5a0._0_16_ = auVar92;
              if (auVar96._0_4_ < 0.0) {
                local_6c0._0_4_ = auVar91._0_4_;
                local_6e0._0_16_ = ZEXT416((uint)fVar218);
                local_660._0_4_ = fVar214;
                local_8b0._0_4_ = fVar218 * -2.0;
                auVar251._0_4_ = sqrtf(auVar96._0_4_);
                auVar251._4_60_ = extraout_var;
                auVar91 = ZEXT416((uint)local_6c0._0_4_);
                auVar92 = auVar251._0_16_;
                auVar96 = local_6e0._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar96,auVar96);
                local_8b0._0_4_ = fVar218 * -2.0;
                local_660._0_4_ = fVar214;
                auVar96 = ZEXT416((uint)fVar218);
              }
              fVar215 = auVar96._0_4_;
              fVar214 = local_900._0_4_;
              auVar93 = vfnmadd231ss_fma(ZEXT416((uint)(fVar214 * (fVar215 + fVar215))),auVar96,
                                         auVar96);
              auVar96 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar214 + fVar214)),
                                        ZEXT416((uint)(fVar214 * fVar214 * 3.0)));
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_900._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar215 * -3.0)),
                                        ZEXT416((uint)(fVar215 + fVar215)),auVar90);
              auVar90 = vfmadd213ss_fma(ZEXT416((uint)local_8b0._0_4_),local_900._0_16_,
                                        ZEXT416((uint)local_660._0_4_));
              fVar214 = auVar93._0_4_ * 0.5;
              fVar215 = auVar96._0_4_ * 0.5;
              fVar216 = auVar97._0_4_ * 0.5;
              fVar164 = auVar90._0_4_ * 0.5;
              auVar202._0_4_ = fVar164 * (float)local_620._0_4_;
              auVar202._4_4_ = fVar164 * (float)local_620._4_4_;
              auVar202._8_4_ = fVar164 * fStack_618;
              auVar202._12_4_ = fVar164 * fStack_614;
              auVar181._4_4_ = fVar216;
              auVar181._0_4_ = fVar216;
              auVar181._8_4_ = fVar216;
              auVar181._12_4_ = fVar216;
              auVar96 = vfmadd132ps_fma(auVar181,auVar202,local_5e0._0_16_);
              auVar165._4_4_ = fVar215;
              auVar165._0_4_ = fVar215;
              auVar165._8_4_ = fVar215;
              auVar165._12_4_ = fVar215;
              auVar96 = vfmadd132ps_fma(auVar165,auVar96,local_600._0_16_);
              auVar252._4_4_ = fVar214;
              auVar252._0_4_ = fVar214;
              auVar252._8_4_ = fVar214;
              auVar252._12_4_ = fVar214;
              _local_6c0 = vfmadd132ps_fma(auVar252,auVar96,local_5c0._0_16_);
              local_660._0_16_ = vdpps_avx(_local_6c0,_local_6c0,0x7f);
              auVar71._12_4_ = 0;
              auVar71._0_12_ = ZEXT812(0);
              fVar214 = local_660._0_4_;
              local_8c0 = vrsqrt14ss_avx512f(auVar71 << 0x20,ZEXT416((uint)fVar214));
              fVar215 = local_8c0._0_4_;
              local_8b0 = vrcp14ss_avx512f(auVar71 << 0x20,ZEXT416((uint)fVar214));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(local_660._0_16_,auVar28);
              auVar96 = vfnmadd213ss_fma(local_8b0,local_660._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6e0._0_4_ = auVar92._0_4_;
              if (fVar214 < auVar90._0_4_) {
                local_8d0._0_4_ = fVar214 * -0.5;
                fVar216 = sqrtf(fVar214);
                auVar92 = ZEXT416((uint)local_6e0._0_4_);
                fVar214 = (float)local_8d0._0_4_;
                auVar90 = _local_6c0;
              }
              else {
                auVar90 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                fVar216 = auVar90._0_4_;
                fVar214 = fVar214 * -0.5;
                auVar90 = _local_6c0;
              }
              fVar164 = local_8c0._0_4_;
              fVar214 = fVar215 * 1.5 + fVar214 * fVar164 * fVar164 * fVar164;
              local_8c0._0_4_ = auVar90._0_4_ * fVar214;
              local_8c0._4_4_ = auVar90._4_4_ * fVar214;
              local_8c0._8_4_ = auVar90._8_4_ * fVar214;
              local_8c0._12_4_ = auVar90._12_4_ * fVar214;
              auVar97 = vdpps_avx(local_7c0._0_16_,local_8c0,0x7f);
              fVar164 = auVar92._0_4_;
              auVar151._0_4_ = auVar97._0_4_ * auVar97._0_4_;
              auVar151._4_4_ = auVar97._4_4_ * auVar97._4_4_;
              auVar151._8_4_ = auVar97._8_4_ * auVar97._8_4_;
              auVar151._12_4_ = auVar97._12_4_ * auVar97._12_4_;
              auVar91 = vsubps_avx512vl(local_7e0._0_16_,auVar151);
              fVar215 = auVar91._0_4_;
              auVar166._4_12_ = ZEXT812(0) << 0x20;
              auVar166._0_4_ = fVar215;
              auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
              if (fVar215 < 0.0) {
                local_8d0 = auVar97;
                local_530 = fVar214;
                fStack_52c = fVar214;
                fStack_528 = fVar214;
                fStack_524 = fVar214;
                local_520 = auVar93;
                fVar215 = sqrtf(fVar215);
                auVar94 = ZEXT416(auVar94._0_4_);
                auVar92 = ZEXT416((uint)local_6e0._0_4_);
                auVar91 = local_520;
                auVar90 = _local_6c0;
                auVar97 = local_8d0;
                fVar214 = local_530;
                fVar217 = fStack_52c;
                fVar218 = fStack_528;
                fVar198 = fStack_524;
              }
              else {
                auVar91 = vsqrtss_avx(auVar91,auVar91);
                fVar215 = auVar91._0_4_;
                auVar91 = auVar93;
                fVar217 = fVar214;
                fVar218 = fVar214;
                fVar198 = fVar214;
              }
              auVar248 = ZEXT1664(local_7c0._0_16_);
              auVar255 = ZEXT3264(local_700);
              auVar256 = ZEXT3264(local_720);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_740);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_760);
              auVar261 = ZEXT3264(local_840);
              auVar262 = ZEXT3264(local_860);
              auVar263 = ZEXT3264(local_780);
              auVar264 = ZEXT3264(local_7a0);
              auVar167._0_4_ = (float)local_4e0._0_4_ * (float)local_620._0_4_;
              auVar167._4_4_ = (float)local_4e0._0_4_ * (float)local_620._4_4_;
              auVar167._8_4_ = (float)local_4e0._0_4_ * fStack_618;
              auVar167._12_4_ = (float)local_4e0._0_4_ * fStack_614;
              auVar182._4_4_ = local_4c0._0_4_;
              auVar182._0_4_ = local_4c0._0_4_;
              auVar182._8_4_ = local_4c0._0_4_;
              auVar182._12_4_ = local_4c0._0_4_;
              auVar239 = vfmadd132ps_fma(auVar182,auVar167,local_5e0._0_16_);
              auVar168._4_4_ = local_4a0._0_4_;
              auVar168._0_4_ = local_4a0._0_4_;
              auVar168._8_4_ = local_4a0._0_4_;
              auVar168._12_4_ = local_4a0._0_4_;
              auVar239 = vfmadd132ps_fma(auVar168,auVar239,local_600._0_16_);
              auVar11 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(0x40000000));
              uVar148 = auVar11._0_4_;
              auVar183._4_4_ = uVar148;
              auVar183._0_4_ = uVar148;
              auVar183._8_4_ = uVar148;
              auVar183._12_4_ = uVar148;
              auVar239 = vfmadd132ps_fma(auVar183,auVar239,local_5c0._0_16_);
              auVar169._0_4_ = auVar239._0_4_ * (float)local_660._0_4_;
              auVar169._4_4_ = auVar239._4_4_ * (float)local_660._0_4_;
              auVar169._8_4_ = auVar239._8_4_ * (float)local_660._0_4_;
              auVar169._12_4_ = auVar239._12_4_ * (float)local_660._0_4_;
              auVar239 = vdpps_avx(auVar90,auVar239,0x7f);
              fVar223 = auVar239._0_4_;
              auVar184._0_4_ = auVar90._0_4_ * fVar223;
              auVar184._4_4_ = auVar90._4_4_ * fVar223;
              auVar184._8_4_ = auVar90._8_4_ * fVar223;
              auVar184._12_4_ = auVar90._12_4_ * fVar223;
              auVar11 = vsubps_avx(auVar169,auVar184);
              fVar223 = auVar96._0_4_ * (float)local_8b0._0_4_;
              auVar239 = vmaxss_avx(ZEXT416((uint)fVar199),
                                    ZEXT416((uint)(local_5a0._0_4_ * fVar147 * 1.9073486e-06)));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar138._16_16_ = local_7a0._16_16_;
              auVar95 = vxorps_avx512vl(auVar90,auVar29);
              auVar185._0_4_ = fVar214 * auVar11._0_4_ * fVar223;
              auVar185._4_4_ = fVar217 * auVar11._4_4_ * fVar223;
              auVar185._8_4_ = fVar218 * auVar11._8_4_ * fVar223;
              auVar185._12_4_ = fVar198 * auVar11._12_4_ * fVar223;
              auVar251 = ZEXT1664(local_8c0);
              auVar96 = vdpps_avx(auVar95,local_8c0,0x7f);
              auVar11 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar199),auVar239);
              auVar92 = vdpps_avx(local_7c0._0_16_,auVar185,0x7f);
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar164 + 1.0)),
                                        ZEXT416((uint)(fVar199 / fVar216)),auVar11);
              fVar214 = auVar96._0_4_ + auVar92._0_4_;
              auVar92 = vdpps_avx(local_580._0_16_,local_8c0,0x7f);
              auVar96 = vdpps_avx(local_7c0._0_16_,auVar95,0x7f);
              auVar94 = vmulss_avx512f(auVar94,auVar91);
              fVar216 = auVar93._0_4_ * 1.5 + auVar94._0_4_ * auVar91._0_4_ * auVar91._0_4_;
              auVar91 = vdpps_avx(local_7c0._0_16_,local_580._0_16_,0x7f);
              auVar94 = vfnmadd231ss_fma(auVar96,auVar97,ZEXT416((uint)fVar214));
              auVar91 = vfnmadd231ss_fma(auVar91,auVar97,auVar92);
              auVar96 = vpermilps_avx(local_480._0_16_,0xff);
              fVar215 = fVar215 - auVar96._0_4_;
              auVar93 = vshufps_avx(auVar90,auVar90,0xff);
              auVar96 = vfmsub213ss_fma(auVar94,ZEXT416((uint)fVar216),auVar93);
              auVar240._8_4_ = 0x80000000;
              auVar240._0_8_ = 0x8000000080000000;
              auVar240._12_4_ = 0x80000000;
              auVar242 = ZEXT1664(auVar240);
              auVar232._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar232._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar232._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar232);
              auVar91 = ZEXT416((uint)(auVar91._0_4_ * fVar216));
              auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar96._0_4_)),
                                        ZEXT416((uint)fVar214),auVar91);
              auVar96 = vinsertps_avx(auVar232,auVar91,0x1c);
              auVar229._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar91 = vinsertps_avx(ZEXT416((uint)fVar214),auVar229,0x10);
              auVar203._0_4_ = auVar94._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar92 = vdivps_avx(auVar96,auVar203);
              auVar96 = vdivps_avx(auVar91,auVar203);
              fVar214 = auVar97._0_4_;
              auVar204._0_4_ = fVar214 * auVar92._0_4_ + fVar215 * auVar96._0_4_;
              auVar204._4_4_ = fVar214 * auVar92._4_4_ + fVar215 * auVar96._4_4_;
              auVar204._8_4_ = fVar214 * auVar92._8_4_ + fVar215 * auVar96._8_4_;
              auVar204._12_4_ = fVar214 * auVar92._12_4_ + fVar215 * auVar96._12_4_;
              auVar92 = vsubps_avx(local_5a0._0_16_,auVar204);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar96 = vandps_avx512vl(auVar97,auVar30);
              if (auVar96._0_4_ < auVar11._0_4_) {
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar239._0_4_)),local_540,
                                          ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(ZEXT416((uint)fVar215),auVar31);
                if (auVar97._0_4_ < auVar96._0_4_) {
                  fVar147 = auVar92._0_4_ + (float)local_550._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar147) &&
                     (fVar214 = (ray->super_RayK<1>).tfar, fVar147 <= fVar214)) {
                    auVar92 = vmovshdup_avx(auVar92);
                    fVar215 = auVar92._0_4_;
                    if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
                      auVar72._12_4_ = 0;
                      auVar72._0_12_ = ZEXT412(0);
                      auVar138._4_12_ = ZEXT412(0);
                      auVar138._0_4_ = local_7e0._0_4_;
                      auVar92 = vrsqrt14ss_avx512f(auVar72 << 0x20,auVar138._0_16_);
                      fVar216 = auVar92._0_4_;
                      auVar92 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar13 = (context->scene->geometries).items[local_910].ptr;
                      if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar216 = fVar216 * 1.5 + auVar92._0_4_ * fVar216 * fVar216 * fVar216;
                        auVar205._0_4_ = local_7c0._0_4_ * fVar216;
                        auVar205._4_4_ = local_7c0._4_4_ * fVar216;
                        auVar205._8_4_ = local_7c0._8_4_ * fVar216;
                        auVar205._12_4_ = local_7c0._12_4_ * fVar216;
                        auVar97 = vfmadd213ps_fma(auVar93,auVar205,auVar90);
                        auVar92 = vshufps_avx(auVar205,auVar205,0xc9);
                        auVar96 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar206._0_4_ = auVar205._0_4_ * auVar96._0_4_;
                        auVar206._4_4_ = auVar205._4_4_ * auVar96._4_4_;
                        auVar206._8_4_ = auVar205._8_4_ * auVar96._8_4_;
                        auVar206._12_4_ = auVar205._12_4_ * auVar96._12_4_;
                        auVar90 = vfmsub231ps_fma(auVar206,auVar90,auVar92);
                        auVar92 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar96 = vshufps_avx(auVar97,auVar97,0xc9);
                        auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                        auVar152._0_4_ = auVar97._0_4_ * auVar90._0_4_;
                        auVar152._4_4_ = auVar97._4_4_ * auVar90._4_4_;
                        auVar152._8_4_ = auVar97._8_4_ * auVar90._8_4_;
                        auVar152._12_4_ = auVar97._12_4_ * auVar90._12_4_;
                        auVar92 = vfmsub231ps_fma(auVar152,auVar92,auVar96);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar147;
                          auVar96 = vshufps_avx(auVar92,auVar92,0xe9);
                          uVar24 = vmovlps_avx(auVar96);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar24;
                          (ray->Ng).field_0.field_0.z = auVar92._0_4_;
                          ray->u = fVar215;
                          ray->v = 0.0;
                          ray->primID = (uint)local_908;
                          ray->geomID = (uint)local_910;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_900._0_4_ = fVar214;
                          auVar96 = vshufps_avx(auVar92,auVar92,0xe9);
                          local_690 = vmovlps_avx(auVar96);
                          local_688 = auVar92._0_4_;
                          local_684 = fVar215;
                          local_680 = 0;
                          local_67c = (uint)local_908;
                          local_678 = (uint)local_910;
                          local_674 = context->user->instID[0];
                          local_670 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar147;
                          local_918 = -1;
                          local_8a0.valid = &local_918;
                          local_8a0.geometryUserPtr = pGVar13->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_690;
                          local_8a0.N = 1;
                          if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d0a991:
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar236 = ZEXT1664(auVar236._0_16_);
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar248 = ZEXT1664(auVar248._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              (*p_Var14)(&local_8a0);
                              auVar264 = ZEXT3264(local_7a0);
                              auVar263 = ZEXT3264(local_780);
                              auVar262 = ZEXT3264(local_860);
                              auVar261 = ZEXT3264(local_840);
                              auVar260 = ZEXT3264(local_760);
                              auVar259 = ZEXT3264(local_820);
                              auVar258 = ZEXT3264(local_740);
                              auVar257 = ZEXT3264(local_800);
                              auVar256 = ZEXT3264(local_720);
                              auVar255 = ZEXT3264(local_700);
                              if (*local_8a0.valid == 0) goto LAB_01d0aa78;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            auVar236 = ZEXT1664(auVar232);
                            auVar242 = ZEXT1664(auVar240);
                            auVar248 = ZEXT1664(local_7c0._0_16_);
                            auVar251 = ZEXT1664(local_8c0);
                            (*pGVar13->intersectionFilterN)(&local_8a0);
                            auVar264 = ZEXT3264(local_7a0);
                            auVar263 = ZEXT3264(local_780);
                            auVar262 = ZEXT3264(local_860);
                            auVar261 = ZEXT3264(local_840);
                            auVar260 = ZEXT3264(local_760);
                            auVar259 = ZEXT3264(local_820);
                            auVar258 = ZEXT3264(local_740);
                            auVar257 = ZEXT3264(local_800);
                            auVar256 = ZEXT3264(local_720);
                            auVar255 = ZEXT3264(local_700);
                            if (*local_8a0.valid != 0) goto LAB_01d0a991;
LAB_01d0aa78:
                            (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar86 = lVar86 + -1;
            } while (lVar86 != 0);
            fVar147 = (ray->super_RayK<1>).tfar;
            auVar162._4_4_ = fVar147;
            auVar162._0_4_ = fVar147;
            auVar162._8_4_ = fVar147;
            auVar162._12_4_ = fVar147;
            auVar162._16_4_ = fVar147;
            auVar162._20_4_ = fVar147;
            auVar162._24_4_ = fVar147;
            auVar162._28_4_ = fVar147;
            auVar78._4_4_ = fStack_3dc;
            auVar78._0_4_ = local_3e0;
            auVar78._8_4_ = fStack_3d8;
            auVar78._12_4_ = fStack_3d4;
            auVar78._16_4_ = fStack_3d0;
            auVar78._20_4_ = fStack_3cc;
            auVar78._24_4_ = fStack_3c8;
            auVar78._28_4_ = fStack_3c4;
            uVar24 = vcmpps_avx512vl(auVar162,auVar78,0xd);
            bVar84 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar84 & (byte)uVar24;
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          } while (bVar84 != 0);
        }
        bVar84 = (byte)local_912 | (byte)local_86c;
        auVar177._0_4_ = (float)local_640._0_4_ + local_460._0_4_;
        auVar177._4_4_ = (float)local_640._4_4_ + local_460._4_4_;
        auVar177._8_4_ = fStack_638 + local_460._8_4_;
        auVar177._12_4_ = fStack_634 + local_460._12_4_;
        auVar177._16_4_ = fStack_630 + local_460._16_4_;
        auVar177._20_4_ = fStack_62c + local_460._20_4_;
        auVar177._24_4_ = fStack_628 + local_460._24_4_;
        auVar177._28_4_ = fStack_624 + local_460._28_4_;
        uVar24 = vcmpps_avx512vl(auVar177,auVar162,2);
        bVar80 = (byte)uVar26 & bVar80 & (byte)uVar24;
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar45._8_4_ = 3;
        auVar45._0_8_ = 0x300000003;
        auVar45._12_4_ = 3;
        auVar45._16_4_ = 3;
        auVar45._20_4_ = 3;
        auVar45._24_4_ = 3;
        auVar45._28_4_ = 3;
        auVar103 = vpblendmd_avx512vl(auVar178,auVar45);
        local_460._0_4_ = (uint)(bVar84 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
        bVar16 = (bool)(bVar84 >> 1 & 1);
        local_460._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar84 >> 2 & 1);
        local_460._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar84 >> 3 & 1);
        local_460._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar84 >> 4 & 1);
        local_460._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar84 >> 5 & 1);
        local_460._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 2;
        bVar16 = (bool)(bVar84 >> 6 & 1);
        local_460._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 2;
        local_460._28_4_ = (uint)(bVar84 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2;
        uVar24 = vpcmpd_avx512vl(local_3a0,local_460,5);
        bVar84 = (byte)uVar24 & bVar80;
        fVar199 = (float)local_640._0_4_;
        fVar147 = (float)local_640._4_4_;
        fVar214 = fStack_638;
        fVar215 = fStack_634;
        fVar216 = fStack_630;
        fVar164 = fStack_62c;
        fVar217 = fStack_628;
        fVar218 = fStack_624;
        if (bVar84 != 0) {
          auVar96 = vminps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar92 = vmaxps_avx(local_5c0._0_16_,local_600._0_16_);
          auVar90 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar97 = vminps_avx(auVar96,auVar90);
          auVar96 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar90 = vmaxps_avx(auVar92,auVar96);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar92 = vandps_avx(auVar97,auVar186);
          auVar96 = vandps_avx(auVar90,auVar186);
          auVar92 = vmaxps_avx(auVar92,auVar96);
          auVar96 = vmovshdup_avx(auVar92);
          auVar96 = vmaxss_avx(auVar96,auVar92);
          auVar92 = vshufpd_avx(auVar92,auVar92,1);
          auVar92 = vmaxss_avx(auVar92,auVar96);
          fVar199 = auVar92._0_4_ * 1.9073486e-06;
          local_540 = vshufps_avx(auVar90,auVar90,0xff);
          local_3e0 = (float)local_640._0_4_ + local_340._0_4_;
          fStack_3dc = (float)local_640._4_4_ + local_340._4_4_;
          fStack_3d8 = fStack_638 + local_340._8_4_;
          fStack_3d4 = fStack_634 + local_340._12_4_;
          fStack_3d0 = fStack_630 + local_340._16_4_;
          fStack_3cc = fStack_62c + local_340._20_4_;
          fStack_3c8 = fStack_628 + local_340._24_4_;
          fStack_3c4 = fStack_624 + local_340._28_4_;
          _local_500 = local_340;
          do {
            auVar104 = local_900;
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar103 = vblendmps_avx512vl(auVar163,_local_500);
            auVar139._0_4_ =
                 (uint)(bVar84 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 1 & 1);
            auVar139._4_4_ = (uint)bVar16 * auVar103._4_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 2 & 1);
            auVar139._8_4_ = (uint)bVar16 * auVar103._8_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 3 & 1);
            auVar139._12_4_ = (uint)bVar16 * auVar103._12_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 4 & 1);
            auVar139._16_4_ = (uint)bVar16 * auVar103._16_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 5 & 1);
            auVar139._20_4_ = (uint)bVar16 * auVar103._20_4_ | (uint)!bVar16 * 0x7f800000;
            bVar16 = (bool)(bVar84 >> 6 & 1);
            auVar139._24_4_ = (uint)bVar16 * auVar103._24_4_ | (uint)!bVar16 * 0x7f800000;
            auVar139._28_4_ =
                 (uint)(bVar84 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar84 >> 7) * 0x7f800000;
            auVar103 = vshufps_avx(auVar139,auVar139,0xb1);
            auVar103 = vminps_avx(auVar139,auVar103);
            auVar101 = vshufpd_avx(auVar103,auVar103,5);
            auVar103 = vminps_avx(auVar103,auVar101);
            auVar101 = vpermpd_avx2(auVar103,0x4e);
            auVar103 = vminps_avx(auVar103,auVar101);
            uVar24 = vcmpps_avx512vl(auVar139,auVar103,0);
            bVar81 = (byte)uVar24 & bVar84;
            bVar15 = bVar84;
            if (bVar81 != 0) {
              bVar15 = bVar81;
            }
            iVar1 = 0;
            for (uVar87 = (uint)bVar15; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar9 = (ray->super_RayK<1>).dir.field_0;
            local_580._0_16_ = (undefined1  [16])aVar9;
            auVar92 = vdpps_avx((undefined1  [16])aVar9,(undefined1  [16])aVar9,0x7f);
            if (auVar92._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar84;
              local_900._2_30_ = auVar104._2_30_;
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
              local_7e0._0_16_ = ZEXT416(*(uint *)(local_320 + (uint)(iVar1 << 2)));
              fVar147 = sqrtf(auVar92._0_4_);
              bVar84 = local_900[0];
              auVar92 = local_7e0._0_16_;
              auVar96 = local_7c0._0_16_;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar147 = auVar92._0_4_;
              auVar92 = ZEXT416(*(uint *)(local_320 + (uint)(iVar1 << 2)));
              auVar96 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
            }
            auVar92 = vinsertps_avx(auVar92,auVar96,0x10);
            lVar86 = 5;
            do {
              uVar148 = auVar92._0_4_;
              auVar153._4_4_ = uVar148;
              auVar153._0_4_ = uVar148;
              auVar153._8_4_ = uVar148;
              auVar153._12_4_ = uVar148;
              auVar90 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_580._0_16_);
              auVar96 = vmovshdup_avx(auVar92);
              fVar217 = auVar96._0_4_;
              fVar218 = 1.0 - fVar217;
              fVar214 = fVar217 * fVar217;
              auVar239 = SUB6416(ZEXT464(0x40400000),0);
              auVar94 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar91 = vfmadd213ss_fma(auVar239,auVar96,auVar94);
              auVar97 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar214),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar93 = vfmadd213ss_fma(auVar239,ZEXT416((uint)fVar218),auVar94);
              auVar93 = vfmadd213ss_fma(auVar93,ZEXT416((uint)(fVar218 * fVar218)),
                                        SUB6416(ZEXT464(0x40000000),0));
              fVar215 = fVar218 * fVar218 * -fVar217 * 0.5;
              fVar216 = auVar97._0_4_ * 0.5;
              fVar164 = auVar93._0_4_ * 0.5;
              fVar217 = fVar217 * fVar217 * -fVar218 * 0.5;
              auVar207._0_4_ = fVar217 * (float)local_620._0_4_;
              auVar207._4_4_ = fVar217 * (float)local_620._4_4_;
              auVar207._8_4_ = fVar217 * fStack_618;
              auVar207._12_4_ = fVar217 * fStack_614;
              auVar220._4_4_ = fVar164;
              auVar220._0_4_ = fVar164;
              auVar220._8_4_ = fVar164;
              auVar220._12_4_ = fVar164;
              auVar97 = vfmadd132ps_fma(auVar220,auVar207,local_5e0._0_16_);
              auVar187._4_4_ = fVar216;
              auVar187._0_4_ = fVar216;
              auVar187._8_4_ = fVar216;
              auVar187._12_4_ = fVar216;
              auVar97 = vfmadd132ps_fma(auVar187,auVar97,local_600._0_16_);
              auVar208._4_4_ = fVar215;
              auVar208._0_4_ = fVar215;
              auVar208._8_4_ = fVar215;
              auVar208._12_4_ = fVar215;
              auVar97 = vfmadd132ps_fma(auVar208,auVar97,local_5c0._0_16_);
              auVar93 = vfmadd231ss_fma(auVar94,auVar96,ZEXT416(0x41100000));
              local_4a0._0_16_ = auVar93;
              auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar96,ZEXT416(0x40800000));
              local_4c0._0_16_ = auVar93;
              local_900._0_16_ = auVar96;
              auVar96 = vfmadd213ss_fma(auVar239,auVar96,ZEXT416(0xbf800000));
              local_4e0._0_16_ = auVar96;
              local_480._0_16_ = auVar97;
              auVar96 = vsubps_avx(auVar90,auVar97);
              local_7c0._0_16_ = auVar96;
              auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
              local_7e0._0_16_ = auVar96;
              local_5a0._0_16_ = auVar92;
              if (auVar96._0_4_ < 0.0) {
                local_6c0._0_4_ = auVar91._0_4_;
                local_6e0._0_16_ = ZEXT416((uint)fVar218);
                local_660._0_4_ = fVar214;
                local_8b0._0_4_ = fVar218 * -2.0;
                auVar242._0_4_ = sqrtf(auVar96._0_4_);
                auVar242._4_60_ = extraout_var_00;
                auVar91 = ZEXT416((uint)local_6c0._0_4_);
                auVar92 = auVar242._0_16_;
                auVar96 = local_6e0._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar96,auVar96);
                local_8b0._0_4_ = fVar218 * -2.0;
                local_660._0_4_ = fVar214;
                auVar96 = ZEXT416((uint)fVar218);
              }
              fVar215 = auVar96._0_4_;
              fVar214 = local_900._0_4_;
              auVar93 = vfnmadd231ss_fma(ZEXT416((uint)(fVar214 * (fVar215 + fVar215))),auVar96,
                                         auVar96);
              auVar96 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar214 + fVar214)),
                                        ZEXT416((uint)(fVar214 * fVar214 * 3.0)));
              auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_900._0_16_,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar215 * -3.0)),
                                        ZEXT416((uint)(fVar215 + fVar215)),auVar90);
              auVar90 = vfmadd213ss_fma(ZEXT416((uint)local_8b0._0_4_),local_900._0_16_,
                                        ZEXT416((uint)local_660._0_4_));
              fVar214 = auVar93._0_4_ * 0.5;
              fVar215 = auVar96._0_4_ * 0.5;
              fVar216 = auVar97._0_4_ * 0.5;
              fVar164 = auVar90._0_4_ * 0.5;
              auVar209._0_4_ = fVar164 * (float)local_620._0_4_;
              auVar209._4_4_ = fVar164 * (float)local_620._4_4_;
              auVar209._8_4_ = fVar164 * fStack_618;
              auVar209._12_4_ = fVar164 * fStack_614;
              auVar188._4_4_ = fVar216;
              auVar188._0_4_ = fVar216;
              auVar188._8_4_ = fVar216;
              auVar188._12_4_ = fVar216;
              auVar96 = vfmadd132ps_fma(auVar188,auVar209,local_5e0._0_16_);
              auVar170._4_4_ = fVar215;
              auVar170._0_4_ = fVar215;
              auVar170._8_4_ = fVar215;
              auVar170._12_4_ = fVar215;
              auVar96 = vfmadd132ps_fma(auVar170,auVar96,local_600._0_16_);
              auVar253._4_4_ = fVar214;
              auVar253._0_4_ = fVar214;
              auVar253._8_4_ = fVar214;
              auVar253._12_4_ = fVar214;
              _local_6c0 = vfmadd132ps_fma(auVar253,auVar96,local_5c0._0_16_);
              local_660._0_16_ = vdpps_avx(_local_6c0,_local_6c0,0x7f);
              auVar73._12_4_ = 0;
              auVar73._0_12_ = ZEXT812(0);
              fVar214 = local_660._0_4_;
              local_8c0 = vrsqrt14ss_avx512f(auVar73 << 0x20,ZEXT416((uint)fVar214));
              fVar215 = local_8c0._0_4_;
              local_8b0 = vrcp14ss_avx512f(auVar73 << 0x20,ZEXT416((uint)fVar214));
              auVar32._8_4_ = 0x80000000;
              auVar32._0_8_ = 0x8000000080000000;
              auVar32._12_4_ = 0x80000000;
              auVar90 = vxorps_avx512vl(local_660._0_16_,auVar32);
              auVar96 = vfnmadd213ss_fma(local_8b0,local_660._0_16_,SUB6416(ZEXT464(0x40000000),0));
              local_6e0._0_4_ = auVar92._0_4_;
              if (fVar214 < auVar90._0_4_) {
                local_8d0._0_4_ = fVar214 * -0.5;
                fVar216 = sqrtf(fVar214);
                auVar92 = ZEXT416((uint)local_6e0._0_4_);
                fVar214 = (float)local_8d0._0_4_;
                auVar90 = _local_6c0;
              }
              else {
                auVar90 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
                fVar216 = auVar90._0_4_;
                fVar214 = fVar214 * -0.5;
                auVar90 = _local_6c0;
              }
              fVar164 = local_8c0._0_4_;
              fVar214 = fVar215 * 1.5 + fVar214 * fVar164 * fVar164 * fVar164;
              local_8c0._0_4_ = auVar90._0_4_ * fVar214;
              local_8c0._4_4_ = auVar90._4_4_ * fVar214;
              local_8c0._8_4_ = auVar90._8_4_ * fVar214;
              local_8c0._12_4_ = auVar90._12_4_ * fVar214;
              auVar97 = vdpps_avx(local_7c0._0_16_,local_8c0,0x7f);
              fVar164 = auVar92._0_4_;
              auVar154._0_4_ = auVar97._0_4_ * auVar97._0_4_;
              auVar154._4_4_ = auVar97._4_4_ * auVar97._4_4_;
              auVar154._8_4_ = auVar97._8_4_ * auVar97._8_4_;
              auVar154._12_4_ = auVar97._12_4_ * auVar97._12_4_;
              auVar91 = vsubps_avx512vl(local_7e0._0_16_,auVar154);
              fVar215 = auVar91._0_4_;
              auVar171._4_12_ = ZEXT812(0) << 0x20;
              auVar171._0_4_ = fVar215;
              auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
              auVar94 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
              if (fVar215 < 0.0) {
                local_8d0 = auVar97;
                local_530 = fVar214;
                fStack_52c = fVar214;
                fStack_528 = fVar214;
                fStack_524 = fVar214;
                local_520 = auVar93;
                fVar215 = sqrtf(fVar215);
                auVar94 = ZEXT416(auVar94._0_4_);
                auVar92 = ZEXT416((uint)local_6e0._0_4_);
                auVar91 = local_520;
                auVar90 = _local_6c0;
                auVar97 = local_8d0;
                fVar214 = local_530;
                fVar217 = fStack_52c;
                fVar218 = fStack_528;
                fVar198 = fStack_524;
              }
              else {
                auVar91 = vsqrtss_avx(auVar91,auVar91);
                fVar215 = auVar91._0_4_;
                auVar91 = auVar93;
                fVar217 = fVar214;
                fVar218 = fVar214;
                fVar198 = fVar214;
              }
              auVar248 = ZEXT1664(local_7c0._0_16_);
              auVar255 = ZEXT3264(local_700);
              auVar256 = ZEXT3264(local_720);
              auVar257 = ZEXT3264(local_800);
              auVar258 = ZEXT3264(local_740);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_760);
              auVar261 = ZEXT3264(local_840);
              auVar262 = ZEXT3264(local_860);
              auVar263 = ZEXT3264(local_780);
              auVar264 = ZEXT3264(local_7a0);
              auVar172._0_4_ = (float)local_4e0._0_4_ * (float)local_620._0_4_;
              auVar172._4_4_ = (float)local_4e0._0_4_ * (float)local_620._4_4_;
              auVar172._8_4_ = (float)local_4e0._0_4_ * fStack_618;
              auVar172._12_4_ = (float)local_4e0._0_4_ * fStack_614;
              auVar189._4_4_ = local_4c0._0_4_;
              auVar189._0_4_ = local_4c0._0_4_;
              auVar189._8_4_ = local_4c0._0_4_;
              auVar189._12_4_ = local_4c0._0_4_;
              auVar239 = vfmadd132ps_fma(auVar189,auVar172,local_5e0._0_16_);
              auVar173._4_4_ = local_4a0._0_4_;
              auVar173._0_4_ = local_4a0._0_4_;
              auVar173._8_4_ = local_4a0._0_4_;
              auVar173._12_4_ = local_4a0._0_4_;
              auVar239 = vfmadd132ps_fma(auVar173,auVar239,local_600._0_16_);
              auVar11 = vfmadd213ss_fma(local_900._0_16_,SUB6416(ZEXT464(0xc0400000),0),
                                        ZEXT416(0x40000000));
              uVar148 = auVar11._0_4_;
              auVar190._4_4_ = uVar148;
              auVar190._0_4_ = uVar148;
              auVar190._8_4_ = uVar148;
              auVar190._12_4_ = uVar148;
              auVar239 = vfmadd132ps_fma(auVar190,auVar239,local_5c0._0_16_);
              auVar174._0_4_ = auVar239._0_4_ * (float)local_660._0_4_;
              auVar174._4_4_ = auVar239._4_4_ * (float)local_660._0_4_;
              auVar174._8_4_ = auVar239._8_4_ * (float)local_660._0_4_;
              auVar174._12_4_ = auVar239._12_4_ * (float)local_660._0_4_;
              auVar239 = vdpps_avx(auVar90,auVar239,0x7f);
              fVar223 = auVar239._0_4_;
              auVar191._0_4_ = auVar90._0_4_ * fVar223;
              auVar191._4_4_ = auVar90._4_4_ * fVar223;
              auVar191._8_4_ = auVar90._8_4_ * fVar223;
              auVar191._12_4_ = auVar90._12_4_ * fVar223;
              auVar11 = vsubps_avx(auVar174,auVar191);
              fVar223 = auVar96._0_4_ * (float)local_8b0._0_4_;
              auVar239 = vmaxss_avx(ZEXT416((uint)fVar199),
                                    ZEXT416((uint)(local_5a0._0_4_ * fVar147 * 1.9073486e-06)));
              auVar33._8_4_ = 0x80000000;
              auVar33._0_8_ = 0x8000000080000000;
              auVar33._12_4_ = 0x80000000;
              auVar140._16_16_ = local_7a0._16_16_;
              auVar95 = vxorps_avx512vl(auVar90,auVar33);
              auVar192._0_4_ = fVar214 * auVar11._0_4_ * fVar223;
              auVar192._4_4_ = fVar217 * auVar11._4_4_ * fVar223;
              auVar192._8_4_ = fVar218 * auVar11._8_4_ * fVar223;
              auVar192._12_4_ = fVar198 * auVar11._12_4_ * fVar223;
              auVar251 = ZEXT1664(local_8c0);
              auVar96 = vdpps_avx(auVar95,local_8c0,0x7f);
              auVar11 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar199),auVar239);
              auVar92 = vdpps_avx(local_7c0._0_16_,auVar192,0x7f);
              auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar164 + 1.0)),
                                        ZEXT416((uint)(fVar199 / fVar216)),auVar11);
              fVar214 = auVar96._0_4_ + auVar92._0_4_;
              auVar92 = vdpps_avx(local_580._0_16_,local_8c0,0x7f);
              auVar96 = vdpps_avx(local_7c0._0_16_,auVar95,0x7f);
              auVar94 = vmulss_avx512f(auVar94,auVar91);
              fVar216 = auVar93._0_4_ * 1.5 + auVar94._0_4_ * auVar91._0_4_ * auVar91._0_4_;
              auVar91 = vdpps_avx(local_7c0._0_16_,local_580._0_16_,0x7f);
              auVar94 = vfnmadd231ss_fma(auVar96,auVar97,ZEXT416((uint)fVar214));
              auVar91 = vfnmadd231ss_fma(auVar91,auVar97,auVar92);
              auVar96 = vpermilps_avx(local_480._0_16_,0xff);
              fVar215 = fVar215 - auVar96._0_4_;
              auVar93 = vshufps_avx(auVar90,auVar90,0xff);
              auVar96 = vfmsub213ss_fma(auVar94,ZEXT416((uint)fVar216),auVar93);
              auVar241._8_4_ = 0x80000000;
              auVar241._0_8_ = 0x8000000080000000;
              auVar241._12_4_ = 0x80000000;
              auVar242 = ZEXT1664(auVar241);
              auVar233._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
              auVar233._8_4_ = auVar96._8_4_ ^ 0x80000000;
              auVar233._12_4_ = auVar96._12_4_ ^ 0x80000000;
              auVar236 = ZEXT1664(auVar233);
              auVar91 = ZEXT416((uint)(auVar91._0_4_ * fVar216));
              auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar92._0_4_ * auVar96._0_4_)),
                                        ZEXT416((uint)fVar214),auVar91);
              auVar96 = vinsertps_avx(auVar233,auVar91,0x1c);
              auVar230._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
              auVar230._8_4_ = auVar92._8_4_ ^ 0x80000000;
              auVar230._12_4_ = auVar92._12_4_ ^ 0x80000000;
              auVar91 = vinsertps_avx(ZEXT416((uint)fVar214),auVar230,0x10);
              auVar210._0_4_ = auVar94._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar92 = vdivps_avx(auVar96,auVar210);
              auVar96 = vdivps_avx(auVar91,auVar210);
              fVar214 = auVar97._0_4_;
              auVar211._0_4_ = fVar214 * auVar92._0_4_ + fVar215 * auVar96._0_4_;
              auVar211._4_4_ = fVar214 * auVar92._4_4_ + fVar215 * auVar96._4_4_;
              auVar211._8_4_ = fVar214 * auVar92._8_4_ + fVar215 * auVar96._8_4_;
              auVar211._12_4_ = fVar214 * auVar92._12_4_ + fVar215 * auVar96._12_4_;
              auVar92 = vsubps_avx(local_5a0._0_16_,auVar211);
              auVar34._8_4_ = 0x7fffffff;
              auVar34._0_8_ = 0x7fffffff7fffffff;
              auVar34._12_4_ = 0x7fffffff;
              auVar96 = vandps_avx512vl(auVar97,auVar34);
              if (auVar96._0_4_ < auVar11._0_4_) {
                auVar96 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + auVar239._0_4_)),local_540,
                                          ZEXT416(0x36000000));
                auVar35._8_4_ = 0x7fffffff;
                auVar35._0_8_ = 0x7fffffff7fffffff;
                auVar35._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(ZEXT416((uint)fVar215),auVar35);
                if (auVar97._0_4_ < auVar96._0_4_) {
                  fVar147 = auVar92._0_4_ + (float)local_550._0_4_;
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar147) &&
                     (fVar214 = (ray->super_RayK<1>).tfar, fVar147 <= fVar214)) {
                    auVar92 = vmovshdup_avx(auVar92);
                    fVar215 = auVar92._0_4_;
                    if ((0.0 <= fVar215) && (fVar215 <= 1.0)) {
                      auVar74._12_4_ = 0;
                      auVar74._0_12_ = ZEXT412(0);
                      auVar140._4_12_ = ZEXT412(0);
                      auVar140._0_4_ = local_7e0._0_4_;
                      auVar92 = vrsqrt14ss_avx512f(auVar74 << 0x20,auVar140._0_16_);
                      fVar216 = auVar92._0_4_;
                      auVar92 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                      pGVar13 = (context->scene->geometries).items[local_910].ptr;
                      if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar216 = fVar216 * 1.5 + auVar92._0_4_ * fVar216 * fVar216 * fVar216;
                        auVar212._0_4_ = local_7c0._0_4_ * fVar216;
                        auVar212._4_4_ = local_7c0._4_4_ * fVar216;
                        auVar212._8_4_ = local_7c0._8_4_ * fVar216;
                        auVar212._12_4_ = local_7c0._12_4_ * fVar216;
                        auVar97 = vfmadd213ps_fma(auVar93,auVar212,auVar90);
                        auVar92 = vshufps_avx(auVar212,auVar212,0xc9);
                        auVar96 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar213._0_4_ = auVar212._0_4_ * auVar96._0_4_;
                        auVar213._4_4_ = auVar212._4_4_ * auVar96._4_4_;
                        auVar213._8_4_ = auVar212._8_4_ * auVar96._8_4_;
                        auVar213._12_4_ = auVar212._12_4_ * auVar96._12_4_;
                        auVar90 = vfmsub231ps_fma(auVar213,auVar90,auVar92);
                        auVar92 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar96 = vshufps_avx(auVar97,auVar97,0xc9);
                        auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                        auVar155._0_4_ = auVar97._0_4_ * auVar90._0_4_;
                        auVar155._4_4_ = auVar97._4_4_ * auVar90._4_4_;
                        auVar155._8_4_ = auVar97._8_4_ * auVar90._8_4_;
                        auVar155._12_4_ = auVar97._12_4_ * auVar90._12_4_;
                        auVar92 = vfmsub231ps_fma(auVar155,auVar92,auVar96);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar147;
                          auVar96 = vshufps_avx(auVar92,auVar92,0xe9);
                          uVar24 = vmovlps_avx(auVar96);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar24;
                          (ray->Ng).field_0.field_0.z = auVar92._0_4_;
                          ray->u = fVar215;
                          ray->v = 0.0;
                          ray->primID = (uint)local_908;
                          ray->geomID = (uint)local_910;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_900._0_4_ = fVar214;
                          auVar96 = vshufps_avx(auVar92,auVar92,0xe9);
                          local_690 = vmovlps_avx(auVar96);
                          local_688 = auVar92._0_4_;
                          local_684 = fVar215;
                          local_680 = 0;
                          local_67c = (uint)local_908;
                          local_678 = (uint)local_910;
                          local_674 = context->user->instID[0];
                          local_670 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar147;
                          local_918 = -1;
                          local_8a0.valid = &local_918;
                          local_8a0.geometryUserPtr = pGVar13->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_690;
                          local_8a0.N = 1;
                          if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d0b5c6:
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar236 = ZEXT1664(auVar236._0_16_);
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              auVar248 = ZEXT1664(auVar248._0_16_);
                              auVar251 = ZEXT1664(auVar251._0_16_);
                              (*p_Var14)(&local_8a0);
                              auVar264 = ZEXT3264(local_7a0);
                              auVar263 = ZEXT3264(local_780);
                              auVar262 = ZEXT3264(local_860);
                              auVar261 = ZEXT3264(local_840);
                              auVar260 = ZEXT3264(local_760);
                              auVar259 = ZEXT3264(local_820);
                              auVar258 = ZEXT3264(local_740);
                              auVar257 = ZEXT3264(local_800);
                              auVar256 = ZEXT3264(local_720);
                              auVar255 = ZEXT3264(local_700);
                              if (*local_8a0.valid == 0) goto LAB_01d0b6ad;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            auVar236 = ZEXT1664(auVar233);
                            auVar242 = ZEXT1664(auVar241);
                            auVar248 = ZEXT1664(local_7c0._0_16_);
                            auVar251 = ZEXT1664(local_8c0);
                            (*pGVar13->intersectionFilterN)(&local_8a0);
                            auVar264 = ZEXT3264(local_7a0);
                            auVar263 = ZEXT3264(local_780);
                            auVar262 = ZEXT3264(local_860);
                            auVar261 = ZEXT3264(local_840);
                            auVar260 = ZEXT3264(local_760);
                            auVar259 = ZEXT3264(local_820);
                            auVar258 = ZEXT3264(local_740);
                            auVar257 = ZEXT3264(local_800);
                            auVar256 = ZEXT3264(local_720);
                            auVar255 = ZEXT3264(local_700);
                            if (*local_8a0.valid != 0) goto LAB_01d0b5c6;
LAB_01d0b6ad:
                            (ray->super_RayK<1>).tfar = (float)local_900._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar86 = lVar86 + -1;
            } while (lVar86 != 0);
            fVar147 = (ray->super_RayK<1>).tfar;
            auVar162._4_4_ = fVar147;
            auVar162._0_4_ = fVar147;
            auVar162._8_4_ = fVar147;
            auVar162._12_4_ = fVar147;
            auVar162._16_4_ = fVar147;
            auVar162._20_4_ = fVar147;
            auVar162._24_4_ = fVar147;
            auVar162._28_4_ = fVar147;
            auVar79._4_4_ = fStack_3dc;
            auVar79._0_4_ = local_3e0;
            auVar79._8_4_ = fStack_3d8;
            auVar79._12_4_ = fStack_3d4;
            auVar79._16_4_ = fStack_3d0;
            auVar79._20_4_ = fStack_3cc;
            auVar79._24_4_ = fStack_3c8;
            auVar79._28_4_ = fStack_3c4;
            uVar24 = vcmpps_avx512vl(auVar162,auVar79,0xd);
            bVar84 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar84 & (byte)uVar24;
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          } while (bVar84 != 0);
          fVar199 = (float)local_640._0_4_;
          fVar147 = (float)local_640._4_4_;
          fVar214 = fStack_638;
          fVar215 = fStack_634;
          fVar216 = fStack_630;
          fVar164 = fStack_62c;
          fVar217 = fStack_628;
          fVar218 = fStack_624;
        }
        auVar266 = ZEXT3264(auVar104);
        auVar265 = ZEXT3264(auVar101);
        uVar26 = vpcmpgtd_avx512vl(local_460,local_3a0);
        uVar27 = vpcmpd_avx512vl(local_3a0,local_300,1);
        auVar196._0_4_ = fVar199 + (float)local_380._0_4_;
        auVar196._4_4_ = fVar147 + (float)local_380._4_4_;
        auVar196._8_4_ = fVar214 + fStack_378;
        auVar196._12_4_ = fVar215 + fStack_374;
        auVar196._16_4_ = fVar216 + fStack_370;
        auVar196._20_4_ = fVar164 + fStack_36c;
        auVar196._24_4_ = fVar217 + fStack_368;
        auVar196._28_4_ = fVar218 + fStack_364;
        uVar24 = vcmpps_avx512vl(auVar196,auVar162,2);
        bVar84 = (byte)local_868 & (byte)uVar27 & (byte)uVar24;
        auVar197._0_4_ = fVar199 + local_340._0_4_;
        auVar197._4_4_ = fVar147 + local_340._4_4_;
        auVar197._8_4_ = fVar214 + local_340._8_4_;
        auVar197._12_4_ = fVar215 + local_340._12_4_;
        auVar197._16_4_ = fVar216 + local_340._16_4_;
        auVar197._20_4_ = fVar164 + local_340._20_4_;
        auVar197._24_4_ = fVar217 + local_340._24_4_;
        auVar197._28_4_ = fVar218 + local_340._28_4_;
        uVar24 = vcmpps_avx512vl(auVar197,auVar162,2);
        bVar80 = bVar80 & (byte)uVar26 & (byte)uVar24 | bVar84;
        prim = local_508;
        if (bVar80 != 0) {
          abStack_180[uVar83 * 0x60] = bVar80;
          bVar16 = (bool)(bVar84 >> 1 & 1);
          bVar17 = (bool)(bVar84 >> 2 & 1);
          bVar18 = (bool)(bVar84 >> 3 & 1);
          bVar19 = (bool)(bVar84 >> 4 & 1);
          bVar20 = (bool)(bVar84 >> 5 & 1);
          bVar21 = (bool)(bVar84 >> 6 & 1);
          auStack_160[uVar83 * 0x18] =
               (uint)(bVar84 & 1) * local_380._0_4_ |
               (uint)!(bool)(bVar84 & 1) * (int)local_340._0_4_;
          auStack_160[uVar83 * 0x18 + 1] =
               (uint)bVar16 * local_380._4_4_ | (uint)!bVar16 * (int)local_340._4_4_;
          auStack_160[uVar83 * 0x18 + 2] =
               (uint)bVar17 * (int)fStack_378 | (uint)!bVar17 * (int)local_340._8_4_;
          auStack_160[uVar83 * 0x18 + 3] =
               (uint)bVar18 * (int)fStack_374 | (uint)!bVar18 * (int)local_340._12_4_;
          auStack_160[uVar83 * 0x18 + 4] =
               (uint)bVar19 * (int)fStack_370 | (uint)!bVar19 * (int)local_340._16_4_;
          auStack_160[uVar83 * 0x18 + 5] =
               (uint)bVar20 * (int)fStack_36c | (uint)!bVar20 * (int)local_340._20_4_;
          auStack_160[uVar83 * 0x18 + 6] =
               (uint)bVar21 * (int)fStack_368 | (uint)!bVar21 * (int)local_340._24_4_;
          auStack_160[uVar83 * 0x18 + 7] =
               (uint)(bVar84 >> 7) * (int)fStack_364 |
               (uint)!(bool)(bVar84 >> 7) * (int)local_340._28_4_;
          uVar89 = vmovlps_avx(local_3b0);
          (&uStack_140)[uVar83 * 0xc] = uVar89;
          aiStack_138[uVar83 * 0x18] = local_864 + 1;
          uVar83 = (ulong)((int)uVar83 + 1);
        }
      }
    }
    fVar198 = (ray->super_RayK<1>).tfar;
    auVar158._4_4_ = fVar198;
    auVar158._0_4_ = fVar198;
    auVar158._8_4_ = fVar198;
    auVar158._12_4_ = fVar198;
    auVar158._16_4_ = fVar198;
    auVar158._20_4_ = fVar198;
    auVar158._24_4_ = fVar198;
    auVar158._28_4_ = fVar198;
    do {
      uVar87 = (uint)uVar83;
      uVar83 = (ulong)(uVar87 - 1);
      if (uVar87 == 0) {
        uVar24 = vcmpps_avx512vl(auVar158,local_2e0,0xd);
        uVar87 = (uint)uVar88 & (uint)uVar24;
        uVar88 = (ulong)uVar87;
        if (uVar87 == 0) {
          return;
        }
        goto LAB_01d08f40;
      }
      auVar103 = *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x18);
      auVar194._0_4_ = fVar199 + auVar103._0_4_;
      auVar194._4_4_ = fVar147 + auVar103._4_4_;
      auVar194._8_4_ = fVar214 + auVar103._8_4_;
      auVar194._12_4_ = fVar215 + auVar103._12_4_;
      auVar194._16_4_ = fVar216 + auVar103._16_4_;
      auVar194._20_4_ = fVar164 + auVar103._20_4_;
      auVar194._24_4_ = fVar217 + auVar103._24_4_;
      auVar194._28_4_ = fVar218 + auVar103._28_4_;
      uVar24 = vcmpps_avx512vl(auVar194,auVar158,2);
      uVar82 = (uint)uVar24 & (uint)abStack_180[uVar83 * 0x60];
    } while (uVar82 == 0);
    uVar89 = (&uStack_140)[uVar83 * 0xc];
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar89;
    auVar195._8_4_ = 0x7f800000;
    auVar195._0_8_ = 0x7f8000007f800000;
    auVar195._12_4_ = 0x7f800000;
    auVar195._16_4_ = 0x7f800000;
    auVar195._20_4_ = 0x7f800000;
    auVar195._24_4_ = 0x7f800000;
    auVar195._28_4_ = 0x7f800000;
    auVar101 = vblendmps_avx512vl(auVar195,auVar103);
    bVar80 = (byte)uVar82;
    auVar136._0_4_ =
         (uint)(bVar80 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar80 & 1) * (int)auVar103._0_4_;
    bVar16 = (bool)((byte)(uVar82 >> 1) & 1);
    auVar136._4_4_ = (uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * (int)auVar103._4_4_;
    bVar16 = (bool)((byte)(uVar82 >> 2) & 1);
    auVar136._8_4_ = (uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * (int)auVar103._8_4_;
    bVar16 = (bool)((byte)(uVar82 >> 3) & 1);
    auVar136._12_4_ = (uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * (int)auVar103._12_4_;
    bVar16 = (bool)((byte)(uVar82 >> 4) & 1);
    auVar136._16_4_ = (uint)bVar16 * auVar101._16_4_ | (uint)!bVar16 * (int)auVar103._16_4_;
    bVar16 = (bool)((byte)(uVar82 >> 5) & 1);
    auVar136._20_4_ = (uint)bVar16 * auVar101._20_4_ | (uint)!bVar16 * (int)auVar103._20_4_;
    bVar16 = (bool)((byte)(uVar82 >> 6) & 1);
    auVar136._24_4_ = (uint)bVar16 * auVar101._24_4_ | (uint)!bVar16 * (int)auVar103._24_4_;
    auVar136._28_4_ =
         (uVar82 >> 7) * auVar101._28_4_ | (uint)!SUB41(uVar82 >> 7,0) * (int)auVar103._28_4_;
    auVar103 = vshufps_avx(auVar136,auVar136,0xb1);
    auVar103 = vminps_avx(auVar136,auVar103);
    auVar101 = vshufpd_avx(auVar103,auVar103,5);
    auVar103 = vminps_avx(auVar103,auVar101);
    auVar101 = vpermpd_avx2(auVar103,0x4e);
    auVar103 = vminps_avx(auVar103,auVar101);
    uVar24 = vcmpps_avx512vl(auVar136,auVar103,0);
    bVar84 = (byte)uVar24 & bVar80;
    if (bVar84 != 0) {
      uVar82 = (uint)bVar84;
    }
    uVar141 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      uVar141 = uVar141 + 1;
    }
    local_864 = aiStack_138[uVar83 * 0x18];
    bVar80 = ~('\x01' << ((byte)uVar141 & 0x1f)) & bVar80;
    abStack_180[uVar83 * 0x60] = bVar80;
    if (bVar80 == 0) {
      uVar87 = uVar87 - 1;
    }
    uVar148 = (undefined4)uVar89;
    auVar176._4_4_ = uVar148;
    auVar176._0_4_ = uVar148;
    auVar176._8_4_ = uVar148;
    auVar176._12_4_ = uVar148;
    auVar176._16_4_ = uVar148;
    auVar176._20_4_ = uVar148;
    auVar176._24_4_ = uVar148;
    auVar176._28_4_ = uVar148;
    auVar92 = vmovshdup_avx(auVar149);
    auVar92 = vsubps_avx(auVar92,auVar149);
    auVar159._0_4_ = auVar92._0_4_;
    auVar159._4_4_ = auVar159._0_4_;
    auVar159._8_4_ = auVar159._0_4_;
    auVar159._12_4_ = auVar159._0_4_;
    auVar159._16_4_ = auVar159._0_4_;
    auVar159._20_4_ = auVar159._0_4_;
    auVar159._24_4_ = auVar159._0_4_;
    auVar159._28_4_ = auVar159._0_4_;
    auVar92 = vfmadd132ps_fma(auVar159,auVar176,_DAT_01faff20);
    _local_380 = ZEXT1632(auVar92);
    local_3b0._8_8_ = 0;
    local_3b0._0_8_ = *(ulong *)(local_380 + (ulong)uVar141 * 4);
    uVar83 = (ulong)uVar87;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }